

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebgodunov_plm.cpp
# Opt level: O2

void EBPLM::PredictVelOnXFace
               (Box *xebox,Array4<double> *Imx,Array4<double> *Ipx,Array4<const_double> *q,
               Array4<const_double> *ccvel,Array4<const_amrex::EBCellFlag> *flag,
               Array4<const_double> *vfrac,Array4<const_double> *fcx,Array4<const_double> *fcy,
               Array4<const_double> *fcz,Array4<const_double> *ccc,Geometry *geom,Real dt,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *h_bcrec,BCRec *pbc)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  BCRec *bcrec;
  long lVar32;
  long lVar33;
  long lVar34;
  double *pdVar35;
  long lVar36;
  long lVar37;
  double *pdVar38;
  long lVar39;
  long lVar40;
  double *pdVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  double *pdVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  EBCellFlag *pEVar49;
  long lVar50;
  long lVar51;
  double *pdVar52;
  long lVar53;
  double *pdVar54;
  long lVar55;
  long lVar56;
  double *pdVar57;
  long lVar58;
  long lVar59;
  long lVar60;
  double *pdVar61;
  long lVar62;
  long lVar63;
  long lVar64;
  double *pdVar65;
  long lVar66;
  long lVar67;
  long lVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  int iVar80;
  pair<bool,_bool> pVar81;
  pair<bool,_bool> pVar82;
  pair<bool,_bool> pVar83;
  int iVar84;
  int iVar85;
  long lVar86;
  long lVar87;
  ulong uVar88;
  long lVar89;
  long lVar90;
  long lVar91;
  long lVar92;
  long lVar93;
  long lVar94;
  long lVar95;
  long lVar96;
  long lVar97;
  long lVar98;
  long lVar99;
  long lVar100;
  long lVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  Real (*paRVar110) [3];
  double *pdVar111;
  Real *pRVar112;
  byte bVar113;
  int iVar114;
  int iVar115;
  long lVar116;
  long lVar117;
  long lVar118;
  long lVar119;
  long lVar120;
  long lVar121;
  long lVar122;
  long lVar123;
  long lVar124;
  long lVar125;
  int dir;
  int dir_00;
  int iVar126;
  int iVar127;
  int iVar128;
  long lVar129;
  long lVar130;
  long lVar131;
  long lVar132;
  long lVar133;
  long lVar134;
  long lVar135;
  long lVar136;
  double *pdVar137;
  int jj_2;
  int iVar138;
  long lVar139;
  long lVar140;
  long lVar141;
  double *pdVar142;
  double *pdVar143;
  int iVar144;
  long lVar145;
  char cVar146;
  int iVar147;
  long lVar148;
  long lVar149;
  int iVar150;
  long lVar151;
  long lVar152;
  long lVar153;
  double *pdVar154;
  double *pdVar155;
  int kk_9;
  int iVar156;
  long lVar157;
  int iVar158;
  long lVar159;
  long lVar160;
  int kk_7;
  int iVar161;
  int iVar162;
  long lVar163;
  long lVar164;
  long lVar165;
  byte bVar166;
  byte bVar167;
  int kk;
  int iVar168;
  long lVar169;
  long lVar170;
  long lVar171;
  char cVar172;
  int j;
  int iVar173;
  int iVar174;
  long lVar175;
  double *pdVar176;
  bool bVar177;
  ulong uVar178;
  double dVar179;
  Real RVar180;
  double dVar181;
  double dVar183;
  undefined1 auVar182 [16];
  double dVar184;
  ulong uVar185;
  double dVar186;
  double dVar187;
  double dVar190;
  undefined1 auVar188 [16];
  undefined8 uVar191;
  undefined1 auVar189 [16];
  undefined4 uVar192;
  undefined4 uVar193;
  undefined4 uVar194;
  undefined4 uVar195;
  double dVar196;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar202;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  double dVar209;
  double dVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  undefined1 auVar214 [16];
  double *local_988;
  int local_97c;
  long local_908;
  undefined1 local_878 [16];
  double *local_868;
  double *local_818;
  double *local_7f0;
  double *local_7e8;
  double *local_7e0;
  double *local_738;
  double *local_730;
  double *local_728;
  double local_6f8 [94];
  double local_408;
  double local_400;
  double local_3f8;
  double local_3e8;
  double dStack_3e0;
  double local_3c8;
  Real du [27];
  Real A [27] [3];
  
  dVar179 = dt / (geom->super_CoordSys).dx[0];
  iVar168 = (geom->domain).smallend.vect[0];
  iVar174 = (geom->domain).smallend.vect[1];
  bcrec = (h_bcrec->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  iVar158 = (geom->domain).bigend.vect[0];
  iVar4 = (geom->domain).bigend.vect[1];
  pVar81 = anon_unknown.dwarf_57803e::has_extdir_or_ho(bcrec,0,(int)Ipx);
  pVar82 = anon_unknown.dwarf_57803e::has_extdir_or_ho(bcrec,1,dir);
  iVar5 = (geom->domain).smallend.vect[2];
  iVar6 = (geom->domain).bigend.vect[2];
  pVar83 = anon_unknown.dwarf_57803e::has_extdir_or_ho(bcrec,2,dir_00);
  if ((((ushort)pVar81 & 1) == 0) || (iVar168 < (xebox->smallend).vect[0] + -1)) {
    iVar7 = (xebox->bigend).vect[0];
    if ((((iVar7 < iVar158 || ((ushort)pVar81 >> 8 & 1) == 0) &&
         ((((ushort)pVar83 & 1) == 0 || (iVar5 < (xebox->smallend).vect[2] + -1)))) &&
        ((((ushort)pVar83 >> 8 & 1) == 0 || ((xebox->bigend).vect[2] < iVar6)))) &&
       (((((ushort)pVar82 & 1) == 0 || (iVar174 < (xebox->smallend).vect[1] + -1)) &&
        ((((ushort)pVar82 >> 8 & 1) == 0 || ((xebox->bigend).vect[1] < iVar4)))))) {
      lVar32 = ccc->nstride;
      iVar168 = (ccc->begin).z;
      lVar86 = (long)(xebox->smallend).vect[2];
      lVar87 = lVar86 + -1;
      lVar33 = ccc->kstride;
      lVar116 = (lVar87 - iVar168) * lVar33;
      iVar174 = (xebox->smallend).vect[0];
      lVar157 = (long)iVar174;
      iVar158 = (ccc->begin).x;
      lVar117 = (long)iVar158;
      iVar4 = (q->begin).z;
      lVar148 = (long)iVar4;
      lVar34 = q->kstride;
      iVar5 = (q->begin).x;
      lVar159 = (long)iVar5;
      pdVar35 = q->p;
      lVar36 = q->jstride;
      lVar37 = q->nstride;
      iVar6 = (q->begin).y;
      uVar88 = (ulong)iVar6;
      pdVar38 = ccvel->p;
      lVar39 = ccvel->jstride;
      lVar40 = ccvel->kstride;
      lVar151 = (long)(ccvel->begin).x;
      iVar7 = (ccvel->begin).y;
      iVar8 = (ccvel->begin).z;
      pdVar41 = Imx->p;
      lVar42 = Imx->jstride;
      lVar43 = Imx->kstride;
      lVar44 = Imx->nstride;
      iVar9 = (Imx->begin).x;
      iVar10 = (Imx->begin).y;
      iVar11 = (Imx->begin).z;
      pdVar45 = Ipx->p;
      lVar46 = Ipx->jstride;
      lVar47 = Ipx->kstride;
      lVar48 = Ipx->nstride;
      uVar12 = (Ipx->begin).x;
      iVar13 = (Ipx->begin).y;
      iVar138 = (Ipx->begin).z;
      pEVar49 = flag->p;
      lVar50 = flag->jstride;
      lVar51 = flag->kstride;
      lVar163 = (long)(flag->begin).x;
      iVar14 = (flag->begin).y;
      iVar15 = (flag->begin).z;
      pdVar52 = ccc->p;
      lVar53 = ccc->jstride;
      iVar16 = (ccc->begin).y;
      pdVar54 = vfrac->p;
      lVar55 = vfrac->jstride;
      lVar56 = vfrac->kstride;
      iVar17 = (vfrac->begin).x;
      lVar139 = (long)iVar17;
      uVar18 = (vfrac->begin).y;
      lVar140 = (long)(int)uVar18;
      uVar19 = (vfrac->begin).z;
      lVar89 = (long)(int)uVar19;
      pdVar57 = fcx->p;
      lVar58 = fcx->jstride;
      lVar59 = fcx->kstride;
      lVar60 = fcx->nstride;
      iVar20 = (fcx->begin).x;
      lVar169 = (long)iVar20;
      iVar21 = (fcx->begin).y;
      iVar22 = (fcx->begin).z;
      pdVar61 = fcy->p;
      lVar62 = fcy->jstride;
      lVar63 = fcy->kstride;
      lVar64 = fcy->nstride;
      lVar170 = (long)(fcy->begin).x;
      iVar23 = (fcy->begin).y;
      iVar24 = (fcy->begin).z;
      pdVar65 = fcz->p;
      lVar66 = fcz->jstride;
      lVar67 = fcz->kstride;
      lVar68 = fcz->nstride;
      lVar171 = (long)(fcz->begin).x;
      iVar25 = (fcz->begin).y;
      iVar26 = (fcz->begin).z;
      iVar27 = (xebox->smallend).vect[1];
      iVar28 = (xebox->bigend).vect[0];
      iVar29 = (xebox->bigend).vect[1];
      iVar30 = (xebox->bigend).vect[2];
      local_818 = pdVar35 + (((lVar87 - lVar148) * lVar34 + lVar157 + -2) - lVar159);
      lVar87 = 0;
      do {
        if (lVar87 == 3) {
          return;
        }
        lVar118 = lVar87 * lVar37;
        local_868 = local_818;
        lVar119 = lVar86;
        local_7f0 = pdVar52 + ((lVar116 + lVar157 + lVar32 * 2 + -1) - lVar117);
        local_7e8 = pdVar52 + ((lVar32 + lVar116 + lVar157 + -1) - lVar117);
        local_7e0 = pdVar52 + ((lVar116 + lVar157 + -1) - lVar117);
        while (lVar119 <= iVar30) {
          lVar90 = (lVar119 - iVar15) * lVar51;
          lVar1 = lVar119 + 1;
          lVar141 = (lVar119 - lVar89) * lVar56;
          lVar91 = (lVar119 - lVar148) * lVar34;
          lVar92 = (lVar119 - iVar8) * lVar40;
          lVar129 = (lVar119 - iVar22) * lVar59;
          lVar130 = (lVar119 - iVar168) * lVar33;
          iVar114 = (int)lVar119;
          iVar126 = iVar114 - iVar4;
          lVar145 = iVar126 * lVar34;
          lVar131 = ((lVar119 + -1) - lVar89) * lVar56;
          lVar132 = (lVar1 - lVar89) * lVar56;
          lVar164 = ((lVar119 + -1) - lVar148) * lVar34;
          lVar133 = (lVar1 - lVar148) * lVar34;
          lVar134 = (lVar119 - iVar24) * lVar63;
          lVar152 = ((int)lVar1 - iVar26) * lVar67;
          lVar153 = (lVar119 - iVar26) * lVar67;
          lVar135 = (int)(~uVar19 + iVar114) * lVar56;
          lVar136 = (int)((int)lVar1 - uVar19) * lVar56;
          lVar175 = (long)iVar27;
          while (lVar175 <= iVar29) {
            if (iVar28 < iVar174) {
              lVar175 = lVar175 + 1;
            }
            else {
              lVar93 = (lVar175 - iVar14) * lVar50;
              lVar94 = (lVar175 - lVar140) * lVar55;
              lVar95 = (lVar175 - uVar88) * lVar36;
              lVar96 = (lVar175 - iVar7) * lVar39;
              lVar97 = (lVar175 - iVar21) * lVar58;
              lVar98 = (lVar175 - iVar16) * lVar53;
              iVar173 = (int)lVar175;
              iVar84 = iVar173 - iVar6;
              lVar99 = iVar84 * lVar36;
              lVar120 = ((lVar175 + -1) - lVar140) * lVar55;
              lVar2 = lVar175 + 1;
              lVar121 = (lVar2 - lVar140) * lVar55;
              lVar100 = ((lVar175 + -1) - uVar88) * lVar36;
              lVar101 = (lVar2 - uVar88) * lVar36;
              lVar102 = ((int)lVar2 - iVar23) * lVar62;
              lVar103 = (lVar175 - iVar23) * lVar62;
              lVar104 = (lVar175 - iVar25) * lVar66;
              lVar105 = (int)(~uVar18 + iVar173) * lVar55;
              lVar106 = (int)((int)lVar2 - uVar18) * lVar55;
              lVar107 = lVar175 - iVar13;
              lVar108 = lVar175 - iVar10;
              lVar122 = (~(long)iVar16 + lVar175) * lVar53 * 8;
              local_730 = (double *)((long)local_7f0 + lVar122);
              local_738 = (double *)((long)local_7e8 + lVar122);
              local_728 = (double *)(lVar122 + (long)local_7e0);
              pdVar176 = (double *)((lVar175 + ~uVar88) * lVar36 * 8 + (long)local_868);
              lVar122 = lVar157;
              local_97c = (iVar174 + -2) - iVar158;
              iVar3 = (iVar174 + -2) - iVar5;
              iVar162 = (iVar174 - iVar5) + -1;
              iVar80 = iVar174 - iVar5;
              do {
                uVar31 = pEVar49[lVar90 + lVar93 + (lVar122 - lVar163)].flag;
                dVar203 = 0.0;
                dVar211 = 0.0;
                iVar85 = (int)lVar122;
                if ((uVar31 >> 0x11 & 1) != 0) {
                  lVar123 = lVar122 - lVar139;
                  dVar187 = pdVar54[lVar94 + lVar123 + lVar141];
                  lVar175 = lVar122 + -1;
                  if ((dVar187 != 1.0) || (NAN(dVar187))) {
LAB_002ea580:
                    lVar124 = lVar122 - lVar169;
                    dVar211 = pdVar57[lVar129 + lVar97 + lVar124];
                    dVar186 = (pdVar57 + lVar129 + lVar97 + lVar124)[lVar60];
                    lVar109 = lVar122 - lVar117;
                    dVar202 = pdVar52[lVar130 + lVar98 + lVar109];
                    dVar204 = pdVar52[lVar130 + lVar98 + lVar109 + lVar32];
                    dVar200 = pdVar52[lVar130 + lVar98 + lVar109 + lVar32 * 2];
                    lVar125 = (long)(iVar85 - iVar5);
                    dVar196 = pdVar35[lVar99 + lVar125 + lVar145 + lVar118];
                    dVar207 = pdVar35[lVar99 + lVar145 + lVar118 + (lVar175 - lVar159)];
                    iVar161 = 0;
                    cVar172 = '\x05';
                    pdVar111 = local_730;
                    pdVar142 = local_738;
                    pdVar154 = local_728;
                    for (lVar109 = -1; lVar109 != 2; lVar109 = lVar109 + 1) {
                      pdVar137 = pdVar111;
                      pdVar143 = pdVar142;
                      pdVar155 = pdVar154;
                      iVar144 = iVar161;
                      cVar146 = cVar172;
                      for (lVar149 = -1; iVar144 = iVar144 + 3, lVar149 != 2; lVar149 = lVar149 + 1)
                      {
                        lVar165 = (long)iVar161;
                        paRVar110 = A + lVar165;
                        iVar161 = iVar161 + 3;
                        for (lVar160 = 0; iVar144 - lVar165 != lVar160; lVar160 = lVar160 + 1) {
                          iVar115 = (int)lVar160 + -1;
                          if ((((int)lVar149 == 0 && (int)lVar109 == 0) && iVar115 == 0) ||
                             ((1 << (cVar146 + (char)lVar160 & 0x1fU) & uVar31) == 0)) {
                            (*paRVar110)[0] = 0.0;
                            (*paRVar110)[1] = 0.0;
                            (*paRVar110)[2] = 0.0;
                          }
                          else {
                            dVar203 = pdVar143[lVar160];
                            (*paRVar110)[0] = (pdVar155[lVar160] + (double)iVar115) - dVar202;
                            (*paRVar110)[1] = (dVar203 + (double)(int)lVar149) - dVar204;
                            (*paRVar110)[2] = (pdVar137[lVar160] + (double)(int)lVar109) - dVar200;
                          }
                          paRVar110 = paRVar110 + 1;
                        }
                        pdVar137 = pdVar137 + lVar53;
                        pdVar143 = pdVar143 + lVar53;
                        pdVar155 = pdVar155 + lVar53;
                        cVar146 = cVar146 + '\x03';
                      }
                      pdVar111 = pdVar111 + lVar33;
                      pdVar142 = pdVar142 + lVar33;
                      pdVar154 = pdVar154 + lVar33;
                      cVar172 = cVar172 + '\t';
                    }
                    iVar161 = 0;
                    cVar172 = '\x05';
                    for (lVar109 = -1; lVar109 != 2; lVar109 = lVar109 + 1) {
                      iVar144 = iVar161;
                      cVar146 = cVar172;
                      for (lVar149 = -1; iVar144 = iVar144 + 3, lVar149 != 2; lVar149 = lVar149 + 1)
                      {
                        lVar160 = (long)iVar161;
                        iVar161 = iVar161 + 3;
                        for (lVar165 = 0; iVar144 - lVar160 != lVar165; lVar165 = lVar165 + 1) {
                          RVar180 = 0.0;
                          if (((int)lVar165 != 1 || ((int)lVar149 != 0 || (int)lVar109 != 0)) &&
                             ((1 << (cVar146 + (char)lVar165 & 0x1fU) & uVar31) != 0)) {
                            RVar180 = pdVar35[lVar118 + (iVar126 + (int)lVar109) * lVar34 +
                                                        (iVar84 + (int)lVar149) * lVar36 +
                                                        (long)(iVar162 + (int)lVar165)] - dVar196;
                          }
                          du[lVar160 + lVar165] = RVar180;
                        }
                        cVar146 = cVar146 + '\x03';
                      }
                      cVar172 = cVar172 + '\t';
                    }
                    pdVar111 = &local_408;
                    for (lVar109 = 0; lVar109 != 3; lVar109 = lVar109 + 1) {
                      for (lVar149 = -0x48; lVar149 != 0; lVar149 = lVar149 + 0x18) {
                        *(undefined8 *)((long)pdVar111 + lVar149 + 0x48) = 0;
                      }
                      local_6f8[lVar109] = 0.0;
                      pdVar111 = pdVar111 + 1;
                    }
                    pRVar112 = A[0] + 2;
                    dVar203 = local_6f8[0];
                    dVar205 = local_408;
                    dVar208 = local_3c8;
                    dVar212 = dStack_3e0;
                    dVar213 = local_400;
                    dVar181 = local_3e8;
                    dVar183 = local_3f8;
                    dVar199 = local_6f8[1];
                    dVar201 = local_6f8[2];
                    for (lVar109 = 0; lVar109 != 0x1b; lVar109 = lVar109 + 1) {
                      dVar190 = (*(Real (*) [3])(pRVar112 + -2))[0];
                      dVar206 = pRVar112[-1];
                      dVar184 = *pRVar112;
                      dVar181 = dVar181 + dVar206 * pRVar112[-1];
                      dVar183 = dVar183 + dVar190 * *pRVar112;
                      dVar212 = dVar212 + dVar184 * dVar206;
                      dVar213 = dVar213 + dVar206 * dVar190;
                      dVar208 = dVar208 + dVar184 * dVar184;
                      dVar184 = du[lVar109];
                      dVar203 = dVar203 + dVar190 * dVar184;
                      dVar205 = dVar205 + dVar190 * dVar190;
                      dVar199 = dVar199 + dVar184 * pRVar112[-1];
                      dVar201 = dVar201 + dVar184 * *pRVar112;
                      pRVar112 = pRVar112 + 3;
                    }
                    dVar184 = dVar213 * dVar208 - dVar183 * dVar212;
                    dVar190 = dVar213 * dVar201 - dVar183 * dVar199;
                    dVar206 = dVar213 * dVar212 + dVar183 * -dVar181;
                    dVar209 = dVar208 * dVar181 - dVar212 * dVar212;
                    dVar208 = dVar208 * dVar199 - dVar212 * dVar201;
                    auVar197._0_8_ =
                         dVar183 * (dVar212 * dVar199 - dVar201 * dVar181) +
                         (dVar203 * dVar209 - dVar208 * dVar213);
                    auVar197._8_8_ = dVar183 * dVar190 + (dVar205 * dVar208 - dVar184 * dVar203);
                    dVar183 = dVar206 * dVar183 + (dVar209 * dVar205 - dVar184 * dVar213);
                    auVar198._8_8_ = dVar183;
                    auVar198._0_8_ = dVar183;
                    auVar198 = divpd(auVar197,auVar198);
                    dVar183 = (dVar206 * dVar203 +
                              ((dVar201 * dVar181 + -dVar199 * dVar212) * dVar205 -
                              dVar190 * dVar213)) / dVar183;
                    dVar205 = auVar198._0_8_;
                    dVar208 = auVar198._8_8_;
                    if ((dVar187 == 1.0) && (!NAN(dVar187))) {
                      if ((pdVar54[lVar94 + lVar141 + (lVar175 - lVar139)] == 1.0) &&
                         (!NAN(pdVar54[lVar94 + lVar141 + (lVar175 - lVar139)]))) {
                        if ((pdVar54[lVar94 + lVar141 + ((lVar122 + 1) - lVar139)] == 1.0) &&
                           (!NAN(pdVar54[lVar94 + lVar141 + ((lVar122 + 1) - lVar139)]))) {
                          dVar181 = pdVar35[lVar99 + lVar145 + lVar118 + ((lVar122 + 1) - lVar159)]
                                    - dVar196;
                          dVar213 = (dVar196 - dVar207) + (dVar196 - dVar207);
                          dVar181 = dVar181 + dVar181;
                          dVar205 = (pdVar35[lVar99 + lVar145 + lVar118 + ((lVar122 + 1) - lVar159)]
                                    - dVar207) * 0.5;
                          dVar203 = ABS(dVar213);
                          uVar178 = -(ulong)(0.0 < dVar205);
                          dVar205 = ABS(dVar205);
                          dVar212 = ABS(dVar181);
                          if (dVar203 <= dVar205) {
                            dVar205 = dVar203;
                          }
                          if (dVar205 <= dVar212) {
                            dVar212 = dVar205;
                          }
                          uVar185 = -(ulong)(0.0 < dVar213 * dVar181) & (ulong)dVar212;
                          dVar205 = (double)(~uVar178 & (uVar185 ^ 0x8000000000000000) |
                                            uVar178 & uVar185);
                        }
                      }
                      if ((((pdVar54[lVar141 + lVar120 + lVar123] == 1.0) &&
                           (!NAN(pdVar54[lVar141 + lVar120 + lVar123]))) &&
                          (pdVar54[lVar141 + lVar121 + lVar123] == 1.0)) &&
                         (!NAN(pdVar54[lVar141 + lVar121 + lVar123]))) {
                        dVar203 = dVar196 - pdVar35[lVar118 + lVar145 + lVar100 + lVar125];
                        dVar208 = pdVar35[lVar118 + lVar145 + lVar101 + lVar125] - dVar196;
                        dVar203 = dVar203 + dVar203;
                        dVar208 = dVar208 + dVar208;
                        dVar213 = (pdVar35[lVar118 + lVar145 + lVar101 + lVar125] -
                                  pdVar35[lVar118 + lVar145 + lVar100 + lVar125]) * 0.5;
                        dVar181 = ABS(dVar203);
                        uVar178 = -(ulong)(0.0 < dVar213);
                        dVar213 = ABS(dVar213);
                        dVar212 = ABS(dVar208);
                        if (dVar181 <= dVar213) {
                          dVar213 = dVar181;
                        }
                        if (dVar213 <= dVar212) {
                          dVar212 = dVar213;
                        }
                        uVar185 = -(ulong)(0.0 < dVar203 * dVar208) & (ulong)dVar212;
                        dVar208 = (double)(~uVar178 & (uVar185 ^ 0x8000000000000000) |
                                          uVar178 & uVar185);
                      }
                      if (((pdVar54[lVar94 + lVar123 + lVar131] == 1.0) &&
                          (!NAN(pdVar54[lVar94 + lVar123 + lVar131]))) &&
                         ((pdVar54[lVar94 + lVar123 + lVar132] == 1.0 &&
                          (!NAN(pdVar54[lVar94 + lVar123 + lVar132]))))) {
                        dVar203 = dVar196 - pdVar35[lVar99 + lVar125 + lVar164 + lVar118];
                        dVar212 = pdVar35[lVar99 + lVar125 + lVar133 + lVar118] - dVar196;
                        dVar203 = dVar203 + dVar203;
                        dVar212 = dVar212 + dVar212;
                        dVar213 = (pdVar35[lVar99 + lVar125 + lVar133 + lVar118] -
                                  pdVar35[lVar99 + lVar125 + lVar164 + lVar118]) * 0.5;
                        dVar183 = ABS(dVar203);
                        uVar178 = -(ulong)(0.0 < dVar213);
                        dVar213 = ABS(dVar213);
                        dVar181 = ABS(dVar212);
                        if (dVar183 <= dVar213) {
                          dVar213 = dVar183;
                        }
                        if (dVar213 <= dVar181) {
                          dVar181 = dVar213;
                        }
                        uVar185 = -(ulong)(0.0 < dVar203 * dVar212) & (ulong)dVar181;
                        dVar183 = (double)(~uVar178 & (uVar185 ^ 0x8000000000000000) |
                                          uVar178 & uVar185);
                      }
                    }
                    dVar203 = dVar207;
                    if (dVar196 <= dVar207) {
                      dVar203 = dVar196;
                    }
                    dVar186 = dVar186 - dVar200;
                    if (dVar207 <= dVar196) {
                      dVar207 = dVar196;
                    }
                    local_878._8_8_ = 0;
                    local_878._0_8_ = dVar207;
                    dVar211 = dVar211 - dVar204;
                    iVar128 = 0;
                    iVar144 = 0;
                    iVar161 = 0;
                    iVar150 = 0;
                    iVar115 = -1;
                    while (iVar115 != 2) {
                      iVar127 = iVar128;
                      iVar147 = -1;
                      while (iVar147 != 2) {
                        for (iVar156 = 5; iVar156 != 8; iVar156 = iVar156 + 1) {
                          if (((uVar31 >> (iVar127 + iVar156 & 0x1fU) & 1) != 0) &&
                             ((iVar156 != 6 || iVar147 != 0) || iVar115 != 0)) {
                            iVar150 = iVar150 + (uint)((iVar156 - 5U & 0xfffffffd) == 0 &&
                                                      (iVar147 == 0 && iVar115 == 0));
                            iVar161 = iVar161 + (uint)((iVar156 == 6 && iVar115 == 0) &&
                                                      (iVar147 == 1 || iVar147 + 1 == 0));
                            iVar144 = iVar144 + (uint)((iVar156 == 6 && iVar147 == 0) &&
                                                      (iVar115 == 1 || iVar115 + 1 == 0));
                          }
                        }
                        iVar127 = iVar127 + 3;
                        iVar147 = iVar147 + 1;
                      }
                      iVar128 = iVar128 + 9;
                      iVar115 = iVar115 + 1;
                    }
                    dVar212 = 2.0;
                    if ((uVar31 >> 0x15 & 1) != 0) {
                      cVar172 = '\b';
                      dVar212 = dVar196;
                      dVar213 = dVar196;
                      for (lVar109 = -1; lVar109 != 2; lVar109 = lVar109 + 1) {
                        cVar146 = cVar172;
                        for (lVar125 = 0; lVar125 != 2; lVar125 = lVar125 + 1) {
                          for (lVar149 = 0; lVar149 != 3; lVar149 = lVar149 + 1) {
                            if (((int)lVar149 == 1 && ((int)lVar125 == 0 && (int)lVar109 == 0)) ||
                               ((1 << (cVar146 + (char)lVar149 & 0x1fU) & uVar31) == 0)) {
LAB_002eb277:
                              uVar192 = SUB84(dVar213,0);
                              uVar193 = (undefined4)((ulong)dVar213 >> 0x20);
                            }
                            else {
                              dVar181 = pdVar35[lVar118 + (iVar126 + (int)lVar109) * lVar34 +
                                                          (iVar84 + (int)lVar125) * lVar36 +
                                                          (long)((int)lVar149 + iVar162)];
                              uVar192 = SUB84(dVar181,0);
                              uVar193 = (undefined4)((ulong)dVar181 >> 0x20);
                              dVar199 = dVar181;
                              if (dVar181 <= dVar212) {
                                dVar199 = dVar212;
                              }
                              dVar212 = dVar199;
                              if (dVar213 <= dVar181) goto LAB_002eb277;
                            }
                            dVar213 = (double)CONCAT44(uVar193,uVar192);
                          }
                          cVar146 = cVar146 + '\x03';
                        }
                        cVar172 = cVar172 + '\t';
                      }
                      dVar181 = (((pdVar61 + lVar134 + lVar102 + (lVar122 - lVar170))[lVar64] -
                                 dVar200) * dVar183 +
                                (0.5 - dVar204) * dVar208 +
                                (pdVar61[lVar134 + lVar102 + (lVar122 - lVar170)] - dVar202) *
                                dVar205 + dVar196) - dVar196;
                      if (dVar181 <= 1e-13) {
                        dVar212 = 1.0;
                        if (dVar181 < -1e-13) {
                          dVar212 = (dVar213 - dVar196) / dVar181;
                          if (1.0 <= dVar212) {
                            dVar212 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar212 = (dVar212 - dVar196) / dVar181;
                        if (1.0 <= dVar212) {
                          dVar212 = 1.0;
                        }
                      }
                      if (2.0 <= dVar212) {
                        dVar212 = 2.0;
                      }
                    }
                    dVar213 = dVar212;
                    if ((short)uVar31 < 0) {
                      cVar172 = '\x05';
                      uVar191 = 0;
                      dVar181 = dVar196;
                      dVar213 = dVar196;
                      for (lVar109 = -1; lVar109 != 2; lVar109 = lVar109 + 1) {
                        cVar146 = cVar172;
                        for (lVar125 = -1; lVar125 != 1; lVar125 = lVar125 + 1) {
                          for (lVar149 = 0; lVar149 != 3; lVar149 = lVar149 + 1) {
                            if (((int)lVar149 == 1 && ((int)lVar125 == 0 && (int)lVar109 == 0)) ||
                               ((1 << (cVar146 + (char)lVar149 & 0x1fU) & uVar31) == 0)) {
                              auVar188._8_8_ = uVar191;
                              auVar188._0_8_ = dVar213;
LAB_002eb406:
                              uVar192 = SUB84(dVar181,0);
                              uVar193 = (undefined4)((ulong)dVar181 >> 0x20);
                            }
                            else {
                              dVar199 = pdVar35[lVar118 + (iVar126 + (int)lVar109) * lVar34 +
                                                          (iVar84 + (int)lVar125) * lVar36 +
                                                          (long)((int)lVar149 + iVar162)];
                              uVar192 = SUB84(dVar199,0);
                              uVar193 = (undefined4)((ulong)dVar199 >> 0x20);
                              dVar201 = dVar199;
                              if (dVar199 <= dVar213) {
                                dVar201 = dVar213;
                              }
                              auVar188._8_8_ = 0;
                              auVar188._0_8_ = dVar201;
                              if (dVar181 <= dVar199) goto LAB_002eb406;
                            }
                            dVar213 = auVar188._0_8_;
                            uVar191 = auVar188._8_8_;
                            dVar181 = (double)CONCAT44(uVar193,uVar192);
                          }
                          cVar146 = cVar146 + '\x03';
                        }
                        cVar172 = cVar172 + '\t';
                      }
                      dVar199 = (((pdVar61 + lVar134 + lVar103 + (lVar122 - lVar170))[lVar64] -
                                 dVar200) * dVar183 +
                                (((pdVar61[lVar134 + lVar103 + (lVar122 - lVar170)] - dVar202) *
                                  dVar205 + dVar196) - (dVar204 + 0.5) * dVar208)) - dVar196;
                      if (dVar199 <= 1e-13) {
                        dVar213 = 1.0;
                        if (dVar199 < -1e-13) {
                          dVar213 = (dVar181 - dVar196) / dVar199;
                          if (1.0 <= dVar213) {
                            dVar213 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar213 = (dVar213 - dVar196) / dVar199;
                        if (1.0 <= dVar213) {
                          dVar213 = 1.0;
                        }
                      }
                      if (dVar212 <= dVar213) {
                        dVar213 = dVar212;
                      }
                    }
                    uVar192 = SUB84(dVar196,0);
                    uVar193 = (undefined4)((ulong)dVar196 >> 0x20);
                    dVar212 = dVar213;
                    if ((uVar31 >> 0x13 & 1) != 0) {
                      cVar172 = '\x06';
                      uVar194 = 0;
                      uVar195 = 0;
                      dVar181 = dVar196;
                      for (lVar109 = -1; lVar109 != 2; lVar109 = lVar109 + 1) {
                        cVar146 = cVar172;
                        for (lVar125 = -1; lVar125 != 2; lVar125 = lVar125 + 1) {
                          for (lVar149 = 0; lVar149 != 2; lVar149 = lVar149 + 1) {
                            if ((((int)lVar125 == 0 && (int)lVar109 == 0) && (int)lVar149 == 0) ||
                               ((1 << (cVar146 + (char)lVar149 & 0x1fU) & uVar31) == 0)) {
                              auVar189._4_4_ = uVar193;
                              auVar189._0_4_ = uVar192;
                              auVar189._12_4_ = uVar195;
                              auVar189._8_4_ = uVar194;
                              dVar212 = dVar181;
                            }
                            else {
                              dVar212 = pdVar35[lVar118 + (iVar126 + (int)lVar109) * lVar34 +
                                                          (iVar84 + (int)lVar125) * lVar36 +
                                                          (long)(iVar80 + (int)lVar149)];
                              dVar199 = dVar212;
                              if (dVar212 <= (double)CONCAT44(uVar193,uVar192)) {
                                dVar199 = (double)CONCAT44(uVar193,uVar192);
                              }
                              auVar189._8_8_ = 0;
                              auVar189._0_8_ = dVar199;
                              if (dVar181 <= dVar212) {
                                dVar212 = dVar181;
                              }
                            }
                            dVar181 = dVar212;
                            uVar192 = auVar189._0_4_;
                            uVar193 = auVar189._4_4_;
                            uVar194 = auVar189._8_4_;
                            uVar195 = auVar189._12_4_;
                          }
                          cVar146 = cVar146 + '\x03';
                        }
                        cVar172 = cVar172 + '\t';
                      }
                      dVar199 = (((pdVar57 + lVar129 + lVar97 + ((iVar85 - iVar20) + 1))[lVar60] -
                                 dVar200) * dVar183 +
                                (pdVar57[lVar129 + lVar97 + ((iVar85 - iVar20) + 1)] - dVar204) *
                                dVar208 + (0.5 - dVar202) * dVar205 + dVar196) - dVar196;
                      if (dVar199 <= 1e-13) {
                        dVar212 = 1.0;
                        if (dVar199 < -1e-13) {
                          dVar212 = (dVar181 - dVar196) / dVar199;
                          if (1.0 <= dVar212) {
                            dVar212 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar212 = ((double)CONCAT44(uVar193,uVar192) - dVar196) / dVar199;
                        if (1.0 <= dVar212) {
                          dVar212 = 1.0;
                        }
                      }
                      if (dVar213 <= dVar212) {
                        dVar212 = dVar213;
                      }
                    }
                    cVar172 = '\x05';
                    dVar213 = dVar196;
                    dVar181 = dVar196;
                    for (lVar109 = -1; lVar109 != 2; lVar109 = lVar109 + 1) {
                      cVar146 = cVar172;
                      for (lVar125 = -1; lVar125 != 2; lVar125 = lVar125 + 1) {
                        for (lVar149 = 0; lVar149 != 2; lVar149 = lVar149 + 1) {
                          uVar192 = SUB84(dVar213,0);
                          uVar193 = (undefined4)((ulong)dVar213 >> 0x20);
                          dVar199 = dVar181;
                          if (((int)lVar149 != 1 || ((int)lVar125 != 0 || (int)lVar109 != 0)) &&
                             ((1 << (cVar146 + (char)lVar149 & 0x1fU) & uVar31) != 0)) {
                            dVar199 = pdVar35[lVar118 + (iVar126 + (int)lVar109) * lVar34 +
                                                        (iVar84 + (int)lVar125) * lVar36 +
                                                        (long)((int)lVar149 + iVar162)];
                            uVar194 = SUB84(dVar199,0);
                            uVar195 = (int)((ulong)dVar199 >> 0x20);
                            if (dVar199 <= dVar213) {
                              uVar194 = uVar192;
                              uVar195 = uVar193;
                            }
                            uVar192 = uVar194;
                            uVar193 = uVar195;
                            if (dVar181 <= dVar199) {
                              dVar199 = dVar181;
                            }
                          }
                          dVar213 = (double)CONCAT44(uVar193,uVar192);
                          dVar181 = dVar199;
                        }
                        cVar146 = cVar146 + '\x03';
                      }
                      cVar172 = cVar172 + '\t';
                    }
                    dVar199 = (dVar186 * dVar183 +
                              dVar211 * dVar208 + (dVar196 - (dVar202 + 0.5) * dVar205)) - dVar196;
                    if (dVar199 <= 1e-13) {
                      dVar213 = 1.0;
                      if ((dVar199 < -1e-13) &&
                         (dVar213 = (dVar181 - dVar196) / dVar199, 1.0 <= dVar213)) {
                        dVar213 = 1.0;
                      }
                    }
                    else {
                      dVar213 = (dVar213 - dVar196) / dVar199;
                      if (1.0 <= dVar213) {
                        dVar213 = 1.0;
                      }
                    }
                    if (dVar212 <= dVar213) {
                      dVar213 = dVar212;
                    }
                    dVar212 = dVar213;
                    if ((uVar31 >> 0x1b & 1) != 0) {
                      cVar172 = '\x0e';
                      dVar181 = dVar196;
                      dVar212 = dVar196;
                      for (lVar109 = 0; lVar109 != 2; lVar109 = lVar109 + 1) {
                        cVar146 = cVar172;
                        for (lVar125 = -1; lVar125 != 2; lVar125 = lVar125 + 1) {
                          for (lVar149 = 0; lVar149 != 3; lVar149 = lVar149 + 1) {
                            uVar192 = SUB84(dVar212,0);
                            uVar193 = (undefined4)((ulong)dVar212 >> 0x20);
                            dVar199 = dVar181;
                            if (((int)lVar149 != 1 || ((int)lVar125 != 0 || (int)lVar109 != 0)) &&
                               ((1 << (cVar146 + (char)lVar149 & 0x1fU) & uVar31) != 0)) {
                              dVar199 = pdVar35[lVar118 + (iVar126 + (int)lVar109) * lVar34 +
                                                          (iVar84 + (int)lVar125) * lVar36 +
                                                          (long)((int)lVar149 + iVar162)];
                              uVar194 = SUB84(dVar199,0);
                              uVar195 = (int)((ulong)dVar199 >> 0x20);
                              if (dVar199 <= dVar212) {
                                uVar194 = uVar192;
                                uVar195 = uVar193;
                              }
                              uVar192 = uVar194;
                              uVar193 = uVar195;
                              if (dVar181 <= dVar199) {
                                dVar199 = dVar181;
                              }
                            }
                            dVar181 = dVar199;
                            dVar212 = (double)CONCAT44(uVar193,uVar192);
                          }
                          cVar146 = cVar146 + '\x03';
                        }
                        cVar172 = cVar172 + '\t';
                      }
                      dVar199 = ((0.5 - dVar200) * dVar183 +
                                ((pdVar65 + lVar104 + lVar152 + (lVar122 - lVar171))[lVar68] -
                                dVar204) * dVar208 +
                                (pdVar65[lVar104 + lVar152 + (lVar122 - lVar171)] - dVar202) *
                                dVar205 + dVar196) - dVar196;
                      if (dVar199 <= 1e-13) {
                        dVar212 = 1.0;
                        if (dVar199 < -1e-13) {
                          dVar212 = (dVar181 - dVar196) / dVar199;
                          if (1.0 <= dVar212) {
                            dVar212 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar212 = (dVar212 - dVar196) / dVar199;
                        if (1.0 <= dVar212) {
                          dVar212 = 1.0;
                        }
                      }
                      if (dVar213 <= dVar212) {
                        dVar212 = dVar213;
                      }
                    }
                    dVar213 = dVar212;
                    if ((uVar31 >> 9 & 1) != 0) {
                      cVar172 = '\x05';
                      dVar181 = dVar196;
                      dVar213 = dVar196;
                      for (lVar109 = -1; lVar109 != 1; lVar109 = lVar109 + 1) {
                        cVar146 = cVar172;
                        for (lVar125 = -1; lVar125 != 2; lVar125 = lVar125 + 1) {
                          for (lVar149 = 0; lVar149 != 3; lVar149 = lVar149 + 1) {
                            uVar192 = SUB84(dVar213,0);
                            uVar193 = (undefined4)((ulong)dVar213 >> 0x20);
                            dVar199 = dVar181;
                            if (((int)lVar149 != 1 || ((int)lVar125 != 0 || (int)lVar109 != 0)) &&
                               ((1 << (cVar146 + (char)lVar149 & 0x1fU) & uVar31) != 0)) {
                              dVar199 = pdVar35[lVar118 + (iVar126 + (int)lVar109) * lVar34 +
                                                          (iVar84 + (int)lVar125) * lVar36 +
                                                          (long)((int)lVar149 + iVar162)];
                              uVar194 = SUB84(dVar199,0);
                              uVar195 = (int)((ulong)dVar199 >> 0x20);
                              if (dVar199 <= dVar213) {
                                uVar194 = uVar192;
                                uVar195 = uVar193;
                              }
                              uVar192 = uVar194;
                              uVar193 = uVar195;
                              if (dVar181 <= dVar199) {
                                dVar199 = dVar181;
                              }
                            }
                            dVar181 = dVar199;
                            dVar213 = (double)CONCAT44(uVar193,uVar192);
                          }
                          cVar146 = cVar146 + '\x03';
                        }
                        cVar172 = cVar172 + '\t';
                      }
                      dVar204 = ((((pdVar65 + lVar104 + lVar153 + (lVar122 - lVar171))[lVar68] -
                                  dVar204) * dVar208 +
                                 (pdVar65[lVar104 + lVar153 + (lVar122 - lVar171)] - dVar202) *
                                 dVar205 + dVar196) - (dVar200 + 0.5) * dVar183) - dVar196;
                      if (dVar204 <= 1e-13) {
                        dVar213 = 1.0;
                        if ((dVar204 < -1e-13) &&
                           (dVar213 = (dVar181 - dVar196) / dVar204, 1.0 <= dVar213)) {
                          dVar213 = 1.0;
                        }
                      }
                      else {
                        dVar213 = (dVar213 - dVar196) / dVar204;
                        if (1.0 <= dVar213) {
                          dVar213 = 1.0;
                        }
                      }
                      if (dVar212 <= dVar213) {
                        dVar213 = dVar212;
                      }
                    }
                    dVar204 = 0.0;
                    if (1 < iVar150) {
                      dVar204 = dVar213;
                    }
                    dVar200 = 0.0;
                    if (1 < iVar161) {
                      dVar200 = dVar213;
                    }
                    dVar212 = 0.0;
                    if (1 < iVar144) {
                      dVar212 = dVar213;
                    }
                    local_908 = lVar175 - lVar139;
                    dVar213 = pdVar54[lVar94 + lVar141 + local_908];
                    if ((dVar187 == 1.0) && (!NAN(dVar187))) {
                      if ((dVar213 == 1.0) &&
                         (((!NAN(dVar213) &&
                           (pdVar54[lVar94 + lVar141 + ((iVar85 - iVar17) + 1)] == 1.0)) &&
                          (!NAN(pdVar54[lVar94 + lVar141 + ((iVar85 - iVar17) + 1)]))))) {
                        dVar204 = 1.0;
                      }
                      if (((pdVar54[lVar141 + lVar105 + lVar123] == 1.0) &&
                          (!NAN(pdVar54[lVar141 + lVar105 + lVar123]))) &&
                         ((pdVar54[lVar141 + lVar106 + lVar123] == 1.0 &&
                          (!NAN(pdVar54[lVar141 + lVar106 + lVar123]))))) {
                        dVar200 = 1.0;
                      }
                      if (((pdVar54[lVar94 + lVar123 + lVar135] == 1.0) &&
                          (!NAN(pdVar54[lVar94 + lVar123 + lVar135]))) &&
                         ((pdVar54[lVar94 + lVar123 + lVar136] == 1.0 &&
                          (!NAN(pdVar54[lVar94 + lVar123 + lVar136]))))) {
                        dVar212 = 1.0;
                      }
                    }
                    dVar186 = dVar186 * dVar183 * dVar212 +
                              dVar211 * dVar208 * dVar200 +
                              (-0.5 - dVar202) * dVar205 * dVar204 + dVar196;
                    dVar211 = dVar207;
                    if (dVar186 <= dVar207) {
                      dVar211 = dVar186;
                    }
                    if (dVar203 <= dVar211) {
                      dVar203 = dVar211;
                    }
                    dVar203 = pdVar38[lVar92 + lVar96 + (lVar122 - lVar151)] * dVar179 * -0.5 *
                              dVar205 * dVar204 + dVar203;
                    local_988 = pdVar54 + lVar94 + local_908;
                    if ((dVar213 == 1.0) && (!NAN(dVar213))) goto LAB_002ebcb0;
                    local_878 = ZEXT416((uint)((ulong)dVar207 >> 0x20)) << 0x20;
LAB_002ec086:
                    dVar186 = pdVar57[lVar129 + lVar97 + lVar124];
                    dVar202 = (pdVar57 + lVar129 + lVar97 + lVar124)[lVar60];
                    pdVar111 = pdVar52 + (iVar114 - iVar168) * lVar33 +
                                         (iVar173 - iVar16) * lVar53 +
                                         (long)((int)lVar175 - iVar158);
                    dVar204 = *pdVar111;
                    dVar200 = pdVar111[lVar32];
                    dVar196 = pdVar111[lVar32 * 2];
                    lVar109 = (long)((int)lVar175 - iVar5);
                    dVar207 = pdVar35[lVar99 + lVar145 + lVar118 + (lVar122 - lVar159)];
                    dVar205 = pdVar35[lVar99 + lVar109 + lVar145 + lVar118];
                    uVar31 = pEVar49[lVar90 + lVar93 + (lVar175 - lVar163)].flag;
                    iVar161 = 0;
                    bVar166 = 5;
                    for (lVar123 = -1; lVar123 != 2; lVar123 = lVar123 + 1) {
                      iVar115 = (int)lVar123;
                      iVar144 = iVar161;
                      bVar167 = bVar166;
                      for (lVar125 = -1; iVar144 = iVar144 + 3, lVar125 != 2; lVar125 = lVar125 + 1)
                      {
                        paRVar110 = A + iVar161;
                        lVar124 = (long)iVar144 - (long)iVar161;
                        iVar127 = (int)lVar125;
                        iVar161 = iVar161 + 3;
                        iVar128 = -1;
                        iVar150 = local_97c;
                        bVar113 = bVar167;
                        while (bVar177 = lVar124 != 0, lVar124 = lVar124 + -1, bVar177) {
                          if (((iVar127 == 0 && iVar115 == 0) && iVar128 == 0) ||
                             ((1 << (bVar113 & 0x1f) & uVar31) == 0)) {
                            (*paRVar110)[0] = 0.0;
                            (*paRVar110)[1] = 0.0;
                            (*paRVar110)[2] = 0.0;
                          }
                          else {
                            pdVar111 = pdVar52 + ((iVar114 - iVar168) + iVar115) * lVar33 +
                                                 ((iVar173 - iVar16) + iVar127) * lVar53 +
                                                 (long)iVar150;
                            dVar211 = pdVar111[lVar32];
                            (*paRVar110)[0] = (*pdVar111 + (double)iVar128) - dVar204;
                            (*paRVar110)[1] = (dVar211 + (double)iVar127) - dVar200;
                            (*paRVar110)[2] = (pdVar111[lVar32 * 2] + (double)iVar115) - dVar196;
                          }
                          paRVar110 = paRVar110 + 1;
                          iVar150 = iVar150 + 1;
                          iVar128 = iVar128 + 1;
                          bVar113 = bVar113 + 1;
                        }
                        bVar167 = bVar167 + 3;
                      }
                      bVar166 = bVar166 + 9;
                    }
                    iVar161 = 0;
                    cVar172 = '\x05';
                    for (lVar123 = -1; lVar123 != 2; lVar123 = lVar123 + 1) {
                      iVar144 = iVar161;
                      cVar146 = cVar172;
                      for (lVar125 = -1; iVar144 = iVar144 + 3, lVar125 != 2; lVar125 = lVar125 + 1)
                      {
                        lVar124 = (long)iVar161;
                        iVar161 = iVar161 + 3;
                        for (lVar149 = 0; iVar144 - lVar124 != lVar149; lVar149 = lVar149 + 1) {
                          RVar180 = 0.0;
                          if (((int)lVar149 != 1 || ((int)lVar125 != 0 || (int)lVar123 != 0)) &&
                             ((1 << (cVar146 + (char)lVar149 & 0x1fU) & uVar31) != 0)) {
                            RVar180 = pdVar35[lVar118 + (iVar126 + (int)lVar123) * lVar34 +
                                                        (iVar84 + (int)lVar125) * lVar36 +
                                                        (long)(iVar3 + (int)lVar149)] - dVar205;
                          }
                          du[lVar124 + lVar149] = RVar180;
                        }
                        cVar146 = cVar146 + '\x03';
                      }
                      cVar172 = cVar172 + '\t';
                    }
                    pdVar111 = &local_408;
                    for (lVar123 = 0; lVar123 != 3; lVar123 = lVar123 + 1) {
                      for (lVar125 = -0x48; lVar125 != 0; lVar125 = lVar125 + 0x18) {
                        *(undefined8 *)((long)pdVar111 + lVar125 + 0x48) = 0;
                      }
                      local_6f8[lVar123] = 0.0;
                      pdVar111 = pdVar111 + 1;
                    }
                    pRVar112 = A[0] + 2;
                    dVar211 = local_6f8[0];
                    dVar208 = local_408;
                    dVar212 = local_3c8;
                    dVar213 = dStack_3e0;
                    dVar181 = local_400;
                    dVar183 = local_3e8;
                    dVar199 = local_3f8;
                    dVar201 = local_6f8[1];
                    dVar184 = local_6f8[2];
                    for (lVar123 = 0; lVar123 != 0x1b; lVar123 = lVar123 + 1) {
                      dVar206 = (*(Real (*) [3])(pRVar112 + -2))[0];
                      dVar209 = pRVar112[-1];
                      dVar190 = *pRVar112;
                      dVar183 = dVar183 + dVar209 * pRVar112[-1];
                      dVar199 = dVar199 + dVar206 * *pRVar112;
                      dVar213 = dVar213 + dVar190 * dVar209;
                      dVar181 = dVar181 + dVar209 * dVar206;
                      dVar212 = dVar212 + dVar190 * dVar190;
                      dVar190 = du[lVar123];
                      dVar211 = dVar211 + dVar206 * dVar190;
                      dVar208 = dVar208 + dVar206 * dVar206;
                      dVar201 = dVar201 + dVar190 * pRVar112[-1];
                      dVar184 = dVar184 + dVar190 * *pRVar112;
                      pRVar112 = pRVar112 + 3;
                    }
                    dVar190 = dVar181 * dVar212 - dVar199 * dVar213;
                    dVar210 = dVar181 * dVar184 - dVar199 * dVar201;
                    dVar206 = dVar181 * dVar213 + dVar199 * -dVar183;
                    dVar209 = dVar212 * dVar183 - dVar213 * dVar213;
                    dVar212 = dVar212 * dVar201 - dVar213 * dVar184;
                    auVar214._0_8_ =
                         dVar199 * (dVar213 * dVar201 - dVar184 * dVar183) +
                         (dVar211 * dVar209 - dVar212 * dVar181);
                    auVar214._8_8_ = dVar199 * dVar210 + (dVar208 * dVar212 - dVar190 * dVar211);
                    dVar199 = dVar206 * dVar199 + (dVar209 * dVar208 - dVar190 * dVar181);
                    auVar182._8_8_ = dVar199;
                    auVar182._0_8_ = dVar199;
                    auVar198 = divpd(auVar214,auVar182);
                    dVar199 = (dVar206 * dVar211 +
                              ((dVar184 * dVar183 + -dVar201 * dVar213) * dVar208 -
                              dVar210 * dVar181)) / dVar199;
                    dVar208 = auVar198._0_8_;
                    dVar212 = auVar198._8_8_;
                    if (local_878[0] != '\0') {
                      if ((dVar187 == 1.0) && (!NAN(dVar187))) {
                        if ((pdVar54[lVar94 + lVar141 + ((lVar122 + -2) - lVar139)] == 1.0) &&
                           (!NAN(pdVar54[lVar94 + lVar141 + ((lVar122 + -2) - lVar139)]))) {
                          dVar181 = dVar205 - pdVar35[lVar99 + lVar145 + lVar118 + ((lVar122 + -2) -
                                                                                   lVar159)];
                          dVar213 = (dVar207 - dVar205) + (dVar207 - dVar205);
                          dVar181 = dVar181 + dVar181;
                          dVar211 = (dVar207 -
                                    pdVar35[lVar99 + lVar145 + lVar118 + ((lVar122 + -2) - lVar159)]
                                    ) * 0.5;
                          dVar183 = ABS(dVar181);
                          uVar178 = -(ulong)(0.0 < dVar211);
                          dVar211 = ABS(dVar211);
                          dVar208 = ABS(dVar213);
                          if (dVar183 <= dVar211) {
                            dVar211 = dVar183;
                          }
                          if (dVar211 <= dVar208) {
                            dVar208 = dVar211;
                          }
                          uVar185 = -(ulong)(0.0 < dVar181 * dVar213) & (ulong)dVar208;
                          dVar208 = (double)(~uVar178 & (uVar185 ^ 0x8000000000000000) |
                                            uVar178 & uVar185);
                        }
                      }
                      if ((((pdVar54[lVar141 + lVar120 + local_908] == 1.0) &&
                           (!NAN(pdVar54[lVar141 + lVar120 + local_908]))) &&
                          (pdVar54[lVar141 + lVar121 + local_908] == 1.0)) &&
                         (!NAN(pdVar54[lVar141 + lVar121 + local_908]))) {
                        dVar181 = dVar205 - pdVar35[lVar118 + lVar145 + lVar100 + lVar109];
                        dVar183 = pdVar35[lVar118 + lVar145 + lVar101 + lVar109] - dVar205;
                        dVar181 = dVar181 + dVar181;
                        dVar183 = dVar183 + dVar183;
                        dVar211 = (pdVar35[lVar118 + lVar145 + lVar101 + lVar109] -
                                  pdVar35[lVar118 + lVar145 + lVar100 + lVar109]) * 0.5;
                        dVar213 = ABS(dVar181);
                        uVar178 = -(ulong)(0.0 < dVar211);
                        dVar211 = ABS(dVar211);
                        dVar212 = ABS(dVar183);
                        if (dVar213 <= dVar211) {
                          dVar211 = dVar213;
                        }
                        if (dVar211 <= dVar212) {
                          dVar212 = dVar211;
                        }
                        uVar185 = -(ulong)(0.0 < dVar181 * dVar183) & (ulong)dVar212;
                        dVar212 = (double)(~uVar178 & (uVar185 ^ 0x8000000000000000) |
                                          uVar178 & uVar185);
                      }
                      if (((local_988[lVar131] == 1.0) && (!NAN(local_988[lVar131]))) &&
                         ((local_988[lVar132] == 1.0 && (!NAN(local_988[lVar132]))))) {
                        dVar183 = dVar205 - pdVar35[lVar99 + lVar109 + lVar164 + lVar118];
                        dVar199 = pdVar35[lVar99 + lVar109 + lVar133 + lVar118] - dVar205;
                        dVar183 = dVar183 + dVar183;
                        dVar199 = dVar199 + dVar199;
                        dVar211 = (pdVar35[lVar99 + lVar109 + lVar133 + lVar118] -
                                  pdVar35[lVar99 + lVar109 + lVar164 + lVar118]) * 0.5;
                        dVar181 = ABS(dVar183);
                        uVar178 = -(ulong)(0.0 < dVar211);
                        dVar211 = ABS(dVar211);
                        dVar213 = ABS(dVar199);
                        if (dVar181 <= dVar211) {
                          dVar211 = dVar181;
                        }
                        if (dVar211 <= dVar213) {
                          dVar213 = dVar211;
                        }
                        uVar185 = -(ulong)(0.0 < dVar183 * dVar199) & (ulong)dVar213;
                        dVar199 = (double)(~uVar178 & (uVar185 ^ 0x8000000000000000) |
                                          uVar178 & uVar185);
                      }
                    }
                    dVar211 = dVar205;
                    if (dVar207 <= dVar205) {
                      dVar211 = dVar207;
                    }
                    dVar202 = dVar202 - dVar196;
                    uVar192 = SUB84(dVar205,0);
                    uVar193 = (undefined4)((ulong)dVar205 >> 0x20);
                    if (dVar205 <= dVar207) {
                      uVar192 = SUB84(dVar207,0);
                      uVar193 = (undefined4)((ulong)dVar207 >> 0x20);
                    }
                    dVar186 = dVar186 - dVar200;
                    iVar128 = 0;
                    iVar144 = 0;
                    iVar161 = 0;
                    iVar150 = 0;
                    iVar115 = -1;
                    while (iVar115 != 2) {
                      iVar127 = iVar128;
                      iVar147 = -1;
                      while (iVar147 != 2) {
                        for (iVar156 = 5; iVar156 != 8; iVar156 = iVar156 + 1) {
                          if (((uVar31 >> (iVar127 + iVar156 & 0x1fU) & 1) != 0) &&
                             ((iVar156 != 6 || iVar147 != 0) || iVar115 != 0)) {
                            iVar150 = iVar150 + (uint)((iVar156 - 5U & 0xfffffffd) == 0 &&
                                                      (iVar147 == 0 && iVar115 == 0));
                            iVar161 = iVar161 + (uint)((iVar156 == 6 && iVar115 == 0) &&
                                                      (iVar147 == 1 || iVar147 + 1 == 0));
                            iVar144 = iVar144 + (uint)((iVar156 == 6 && iVar147 == 0) &&
                                                      (iVar115 == 1 || iVar115 + 1 == 0));
                          }
                        }
                        iVar127 = iVar127 + 3;
                        iVar147 = iVar147 + 1;
                      }
                      iVar128 = iVar128 + 9;
                      iVar115 = iVar115 + 1;
                    }
                    dVar207 = 2.0;
                    if ((uVar31 >> 0x15 & 1) != 0) {
                      cVar172 = '\b';
                      dVar207 = dVar205;
                      dVar213 = dVar205;
                      for (lVar123 = -1; lVar123 != 2; lVar123 = lVar123 + 1) {
                        cVar146 = cVar172;
                        for (lVar109 = 0; lVar109 != 2; lVar109 = lVar109 + 1) {
                          for (lVar125 = 0; lVar125 != 3; lVar125 = lVar125 + 1) {
                            if (((int)lVar125 != 1 || ((int)lVar109 != 0 || (int)lVar123 != 0)) &&
                               ((1 << (cVar146 + (char)lVar125 & 0x1fU) & uVar31) != 0)) {
                              dVar181 = pdVar35[lVar118 + (iVar126 + (int)lVar123) * lVar34 +
                                                          (iVar84 + (int)lVar109) * lVar36 +
                                                          (long)(iVar3 + (int)lVar125)];
                              dVar183 = dVar181;
                              if (dVar181 <= dVar207) {
                                dVar183 = dVar207;
                              }
                              dVar207 = dVar183;
                              if (dVar181 < dVar213) {
                                dVar213 = dVar181;
                              }
                            }
                          }
                          cVar146 = cVar146 + '\x03';
                        }
                        cVar172 = cVar172 + '\t';
                      }
                      dVar181 = (((pdVar61 + lVar134 + lVar102 + (lVar175 - lVar170))[lVar64] -
                                 dVar196) * dVar199 +
                                (0.5 - dVar200) * dVar212 +
                                (pdVar61[lVar134 + lVar102 + (lVar175 - lVar170)] - dVar204) *
                                dVar208 + dVar205) - dVar205;
                      if (dVar181 <= 1e-13) {
                        dVar207 = 1.0;
                        if ((dVar181 < -1e-13) &&
                           (dVar207 = (dVar213 - dVar205) / dVar181, 1.0 <= dVar207)) {
                          dVar207 = 1.0;
                        }
                      }
                      else {
                        dVar207 = (dVar207 - dVar205) / dVar181;
                        if (1.0 <= dVar207) {
                          dVar207 = 1.0;
                        }
                      }
                      if (2.0 <= dVar207) {
                        dVar207 = 2.0;
                      }
                    }
                    dVar213 = dVar207;
                    if ((short)uVar31 < 0) {
                      cVar172 = '\x05';
                      pdVar111 = pdVar176;
                      dVar181 = dVar205;
                      dVar213 = dVar205;
                      for (lVar123 = -1; lVar123 != 2; lVar123 = lVar123 + 1) {
                        pdVar142 = pdVar111;
                        cVar146 = cVar172;
                        for (lVar109 = -1; lVar109 != 1; lVar109 = lVar109 + 1) {
                          for (lVar125 = 0; lVar125 != 3; lVar125 = lVar125 + 1) {
                            if (((int)lVar125 != 1 || ((int)lVar109 != 0 || (int)lVar123 != 0)) &&
                               ((1 << (cVar146 + (char)lVar125 & 0x1fU) & uVar31) != 0)) {
                              dVar183 = pdVar142[lVar125];
                              dVar201 = dVar183;
                              if (dVar183 <= dVar213) {
                                dVar201 = dVar213;
                              }
                              dVar213 = dVar201;
                              if (dVar183 < dVar181) {
                                dVar181 = dVar183;
                              }
                            }
                          }
                          pdVar142 = pdVar142 + lVar36;
                          cVar146 = cVar146 + '\x03';
                        }
                        pdVar111 = pdVar111 + lVar34;
                        cVar172 = cVar172 + '\t';
                      }
                      dVar183 = (((pdVar61 + lVar134 + lVar103 + (lVar175 - lVar170))[lVar64] -
                                 dVar196) * dVar199 +
                                (((pdVar61[lVar134 + lVar103 + (lVar175 - lVar170)] - dVar204) *
                                  dVar208 + dVar205) - (dVar200 + 0.5) * dVar212)) - dVar205;
                      if (dVar183 <= 1e-13) {
                        dVar213 = 1.0;
                        if ((dVar183 < -1e-13) &&
                           (dVar213 = (dVar181 - dVar205) / dVar183, 1.0 <= dVar213)) {
                          dVar213 = 1.0;
                        }
                      }
                      else {
                        dVar213 = (dVar213 - dVar205) / dVar183;
                        if (1.0 <= dVar213) {
                          dVar213 = 1.0;
                        }
                      }
                      if (dVar207 <= dVar213) {
                        dVar213 = dVar207;
                      }
                    }
                    dVar207 = dVar213;
                    if ((uVar31 >> 0x13 & 1) != 0) {
                      cVar172 = '\x06';
                      dVar181 = dVar205;
                      dVar207 = dVar205;
                      for (lVar123 = -1; lVar123 != 2; lVar123 = lVar123 + 1) {
                        cVar146 = cVar172;
                        for (lVar109 = -1; lVar109 != 2; lVar109 = lVar109 + 1) {
                          for (lVar125 = 0; lVar125 != 2; lVar125 = lVar125 + 1) {
                            dVar183 = dVar181;
                            if ((((int)lVar109 != 0 || (int)lVar123 != 0) || (int)lVar125 != 0) &&
                               ((1 << (cVar146 + (char)lVar125 & 0x1fU) & uVar31) != 0)) {
                              dVar183 = pdVar35[lVar118 + (iVar126 + (int)lVar123) * lVar34 +
                                                          (iVar84 + (int)lVar109) * lVar36 +
                                                          (long)(iVar162 + (int)lVar125)];
                              dVar201 = dVar183;
                              if (dVar183 <= dVar207) {
                                dVar201 = dVar207;
                              }
                              dVar207 = dVar201;
                              if (dVar181 <= dVar183) {
                                dVar183 = dVar181;
                              }
                            }
                            dVar181 = dVar183;
                          }
                          cVar146 = cVar146 + '\x03';
                        }
                        cVar172 = cVar172 + '\t';
                      }
                      dVar183 = (dVar202 * dVar199 +
                                dVar186 * dVar212 + (0.5 - dVar204) * dVar208 + dVar205) - dVar205;
                      if (dVar183 <= 1e-13) {
                        dVar207 = 1.0;
                        if ((dVar183 < -1e-13) &&
                           (dVar207 = (dVar181 - dVar205) / dVar183, 1.0 <= dVar207)) {
                          dVar207 = 1.0;
                        }
                      }
                      else {
                        dVar207 = (dVar207 - dVar205) / dVar183;
                        if (1.0 <= dVar207) {
                          dVar207 = 1.0;
                        }
                      }
                      if (dVar213 <= dVar207) {
                        dVar207 = dVar213;
                      }
                    }
                    dVar213 = dVar207;
                    if ((uVar31 >> 0x11 & 1) != 0) {
                      cVar172 = '\x05';
                      dVar213 = dVar205;
                      dVar181 = dVar205;
                      for (lVar123 = -1; lVar123 != 2; lVar123 = lVar123 + 1) {
                        cVar146 = cVar172;
                        for (lVar109 = -1; lVar109 != 2; lVar109 = lVar109 + 1) {
                          for (lVar125 = 0; lVar125 != 2; lVar125 = lVar125 + 1) {
                            dVar183 = dVar181;
                            if (((int)lVar125 != 1 || ((int)lVar109 != 0 || (int)lVar123 != 0)) &&
                               ((1 << (cVar146 + (char)lVar125 & 0x1fU) & uVar31) != 0)) {
                              dVar183 = pdVar35[lVar118 + (iVar126 + (int)lVar123) * lVar34 +
                                                          (iVar84 + (int)lVar109) * lVar36 +
                                                          (long)(iVar3 + (int)lVar125)];
                              dVar201 = dVar183;
                              if (dVar183 <= dVar213) {
                                dVar201 = dVar213;
                              }
                              dVar213 = dVar201;
                              if (dVar181 <= dVar183) {
                                dVar183 = dVar181;
                              }
                            }
                            dVar181 = dVar183;
                          }
                          cVar146 = cVar146 + '\x03';
                        }
                        cVar172 = cVar172 + '\t';
                      }
                      dVar183 = (((pdVar57 + lVar129 + lVar97 + (lVar175 - lVar169))[lVar60] -
                                 dVar196) * dVar199 +
                                (pdVar57[lVar129 + lVar97 + (lVar175 - lVar169)] - dVar200) *
                                dVar212 + (dVar205 - (dVar204 + 0.5) * dVar208)) - dVar205;
                      if (dVar183 <= 1e-13) {
                        dVar213 = 1.0;
                        if (dVar183 < -1e-13) {
                          dVar213 = (dVar181 - dVar205) / dVar183;
                          if (1.0 <= dVar213) {
                            dVar213 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar213 = (dVar213 - dVar205) / dVar183;
                        if (1.0 <= dVar213) {
                          dVar213 = 1.0;
                        }
                      }
                      if (dVar207 <= dVar213) {
                        dVar213 = dVar207;
                      }
                    }
                    dVar207 = dVar213;
                    if ((uVar31 >> 0x1b & 1) != 0) {
                      cVar172 = '\x0e';
                      dVar207 = dVar205;
                      dVar181 = dVar205;
                      for (lVar123 = 0; lVar123 != 2; lVar123 = lVar123 + 1) {
                        cVar146 = cVar172;
                        for (lVar109 = -1; lVar109 != 2; lVar109 = lVar109 + 1) {
                          for (lVar125 = 0; lVar125 != 3; lVar125 = lVar125 + 1) {
                            dVar183 = dVar181;
                            if (((int)lVar125 != 1 || ((int)lVar109 != 0 || (int)lVar123 != 0)) &&
                               ((1 << (cVar146 + (char)lVar125 & 0x1fU) & uVar31) != 0)) {
                              dVar183 = pdVar35[lVar118 + (iVar126 + (int)lVar123) * lVar34 +
                                                          (iVar84 + (int)lVar109) * lVar36 +
                                                          (long)(iVar3 + (int)lVar125)];
                              dVar201 = dVar183;
                              if (dVar183 <= dVar207) {
                                dVar201 = dVar207;
                              }
                              dVar207 = dVar201;
                              if (dVar181 <= dVar183) {
                                dVar183 = dVar181;
                              }
                            }
                            dVar181 = dVar183;
                          }
                          cVar146 = cVar146 + '\x03';
                        }
                        cVar172 = cVar172 + '\t';
                      }
                      dVar183 = ((0.5 - dVar196) * dVar199 +
                                ((pdVar65 + lVar104 + lVar152 + (lVar175 - lVar171))[lVar68] -
                                dVar200) * dVar212 +
                                (pdVar65[lVar104 + lVar152 + (lVar175 - lVar171)] - dVar204) *
                                dVar208 + dVar205) - dVar205;
                      if (dVar183 <= 1e-13) {
                        dVar207 = 1.0;
                        if (dVar183 < -1e-13) {
                          dVar207 = (dVar181 - dVar205) / dVar183;
                          if (1.0 <= dVar207) {
                            dVar207 = 1.0;
                          }
                        }
                      }
                      else {
                        dVar207 = (dVar207 - dVar205) / dVar183;
                        if (1.0 <= dVar207) {
                          dVar207 = 1.0;
                        }
                      }
                      if (dVar213 <= dVar207) {
                        dVar207 = dVar213;
                      }
                    }
                    dVar213 = dVar207;
                    if ((uVar31 >> 9 & 1) != 0) {
                      cVar172 = '\x05';
                      dVar181 = dVar205;
                      dVar213 = dVar205;
                      for (lVar123 = -1; lVar123 != 1; lVar123 = lVar123 + 1) {
                        cVar146 = cVar172;
                        for (lVar109 = -1; lVar109 != 2; lVar109 = lVar109 + 1) {
                          for (lVar125 = 0; lVar125 != 3; lVar125 = lVar125 + 1) {
                            dVar183 = dVar181;
                            if (((int)lVar125 != 1 || ((int)lVar109 != 0 || (int)lVar123 != 0)) &&
                               ((1 << (cVar146 + (char)lVar125 & 0x1fU) & uVar31) != 0)) {
                              dVar183 = pdVar35[lVar118 + (iVar126 + (int)lVar123) * lVar34 +
                                                          (iVar84 + (int)lVar109) * lVar36 +
                                                          (long)(iVar3 + (int)lVar125)];
                              dVar201 = dVar183;
                              if (dVar183 <= dVar213) {
                                dVar201 = dVar213;
                              }
                              dVar213 = dVar201;
                              if (dVar181 <= dVar183) {
                                dVar183 = dVar181;
                              }
                            }
                            dVar181 = dVar183;
                          }
                          cVar146 = cVar146 + '\x03';
                        }
                        cVar172 = cVar172 + '\t';
                      }
                      dVar200 = ((((pdVar65 + lVar104 + lVar153 + (lVar175 - lVar171))[lVar68] -
                                  dVar200) * dVar212 +
                                 (pdVar65[lVar104 + lVar153 + (lVar175 - lVar171)] - dVar204) *
                                 dVar208 + dVar205) - (dVar196 + 0.5) * dVar199) - dVar205;
                      if (dVar200 <= 1e-13) {
                        dVar213 = 1.0;
                        if ((dVar200 < -1e-13) &&
                           (dVar213 = (dVar181 - dVar205) / dVar200, 1.0 <= dVar213)) {
                          dVar213 = 1.0;
                        }
                      }
                      else {
                        dVar213 = (dVar213 - dVar205) / dVar200;
                        if (1.0 <= dVar213) {
                          dVar213 = 1.0;
                        }
                      }
                      if (dVar207 <= dVar213) {
                        dVar213 = dVar207;
                      }
                    }
                    dVar200 = 0.0;
                    if (1 < iVar150) {
                      dVar200 = dVar213;
                    }
                    dVar196 = 0.0;
                    if (1 < iVar161) {
                      dVar196 = dVar213;
                    }
                    dVar207 = 0.0;
                    if (1 < iVar144) {
                      dVar207 = dVar213;
                    }
                    lVar123 = lVar175 - lVar139;
                    if ((pdVar54[lVar94 + lVar123 + lVar141] == 1.0) &&
                       (!NAN(pdVar54[lVar94 + lVar123 + lVar141]))) {
                      if ((pdVar54[lVar141 + lVar105 + lVar123] == 1.0) &&
                         (((!NAN(pdVar54[lVar141 + lVar105 + lVar123]) &&
                           (pdVar54[lVar141 + lVar106 + lVar123] == 1.0)) &&
                          (!NAN(pdVar54[lVar141 + lVar106 + lVar123]))))) {
                        dVar196 = 1.0;
                      }
                      dVar200 = (double)(~-(ulong)(dVar187 == 1.0) & (ulong)dVar200 |
                                        (~-(ulong)(pdVar54[lVar94 + lVar141 + ((iVar85 - iVar17) +
                                                                              -2)] == 1.0) &
                                         (ulong)dVar200 |
                                        -(ulong)(pdVar54[lVar94 + lVar141 + ((iVar85 - iVar17) + -2)
                                                        ] == 1.0) & 0x3ff0000000000000) &
                                        -(ulong)(dVar187 == 1.0));
                      if (((pdVar54[lVar94 + lVar123 + lVar135] == 1.0) &&
                          (!NAN(pdVar54[lVar94 + lVar123 + lVar135]))) &&
                         ((pdVar54[lVar94 + lVar123 + lVar136] == 1.0 &&
                          (!NAN(pdVar54[lVar94 + lVar123 + lVar136]))))) {
                        dVar207 = 1.0;
                      }
                    }
                    dVar208 = dVar208 * dVar200;
                    dVar186 = dVar202 * dVar199 * dVar207 +
                              dVar186 * dVar212 * dVar196 + (0.5 - dVar204) * dVar208 + dVar205;
                    dVar187 = (double)CONCAT44(uVar193,uVar192);
                    if (dVar186 <= (double)CONCAT44(uVar193,uVar192)) {
                      dVar187 = dVar186;
                    }
                    if (dVar211 <= dVar187) {
                      dVar211 = dVar187;
                    }
                    dVar187 = pdVar38[lVar92 + lVar96 + (lVar175 - lVar151)] * dVar179 * -0.5;
                  }
                  else {
                    local_908 = lVar175 - lVar139;
                    local_988 = pdVar54 + lVar94 + local_908;
                    if ((local_988[lVar141] != 1.0) || (NAN(local_988[lVar141]))) goto LAB_002ea580;
                    dVar211 = pdVar54[lVar94 + lVar141 + lVar123 + 1];
                    if ((((pdVar54[lVar94 + lVar141 + ((lVar122 + -2) - lVar139)] != 1.0) ||
                         (NAN(pdVar54[lVar94 + lVar141 + ((lVar122 + -2) - lVar139)]))) ||
                        (dVar211 != 1.0)) || (NAN(dVar211))) {
                      if ((dVar211 != 1.0) || (NAN(dVar211))) goto LAB_002ea580;
LAB_002ec7f4:
                      dVar203 = pdVar35[lVar118 + lVar91 + lVar95 + (lVar122 - lVar159)];
                      dVar211 = (pdVar35 + lVar118 + lVar91 + lVar95 + (lVar122 - lVar159))[1];
                      dVar204 = dVar203 - pdVar35[lVar118 + lVar91 + lVar95 + (lVar175 - lVar159)];
                      dVar200 = dVar211 - dVar203;
                      dVar204 = dVar204 + dVar204;
                      dVar200 = dVar200 + dVar200;
                      dVar211 = (dVar211 - pdVar35[lVar118 + lVar91 + lVar95 + (lVar175 - lVar159)])
                                * 0.5;
                      dVar202 = ABS(dVar204);
                      uVar178 = -(ulong)(0.0 < dVar211);
                      dVar211 = ABS(dVar211);
                      dVar186 = ABS(dVar200);
                      if (dVar202 <= dVar211) {
                        dVar211 = dVar202;
                      }
                      if (dVar211 <= dVar186) {
                        dVar186 = dVar211;
                      }
                      uVar185 = -(ulong)(0.0 < dVar204 * dVar200) & (ulong)dVar186;
                      dVar203 = (double)(~uVar178 & (uVar185 ^ 0x8000000000000000) |
                                        uVar178 & uVar185) *
                                (-1.0 - pdVar38[lVar92 + lVar96 + (lVar122 - lVar151)] * dVar179) *
                                0.5 + dVar203;
                    }
                    else {
                      if ((pdVar54[lVar94 + lVar141 + ((lVar122 + 2) - lVar139)] != 1.0) ||
                         (NAN(pdVar54[lVar94 + lVar141 + ((lVar122 + 2) - lVar139)])))
                      goto LAB_002ec7f4;
                      dVar203 = pdVar35[lVar118 + lVar91 + lVar95 + (lVar122 - lVar159)];
                      dVar211 = (pdVar35 + lVar118 + lVar91 + lVar95 + (lVar122 - lVar159))[1];
                      dVar186 = (pdVar35 + lVar118 + lVar91 + lVar95 + ((lVar122 + -2) - lVar159))
                                [1];
                      dVar200 = dVar186 - pdVar35[lVar118 + lVar91 + lVar95 + ((lVar122 + -2) -
                                                                              lVar159)];
                      dVar186 = dVar203 - dVar186;
                      dVar204 = 0.0;
                      dVar202 = 0.0;
                      if (0.0 <= dVar186 * dVar200) {
                        dVar202 = ABS(dVar186);
                        if (ABS(dVar200) <= ABS(dVar186)) {
                          dVar202 = ABS(dVar200);
                        }
                        dVar202 = dVar202 + dVar202;
                      }
                      dVar207 = dVar211 - dVar203;
                      dVar211 = pdVar35[lVar118 + lVar91 + lVar95 + ((lVar122 + 2) - lVar159)] -
                                dVar211;
                      dVar196 = (dVar207 + dVar211) * 0.5;
                      if (0.0 <= dVar211 * dVar207) {
                        dVar204 = ABS(dVar211);
                        if (ABS(dVar207) <= ABS(dVar211)) {
                          dVar204 = ABS(dVar207);
                        }
                        dVar204 = dVar204 + dVar204;
                      }
                      dVar205 = (dVar186 + dVar207) * 0.5;
                      dVar211 = 0.0;
                      if (0.0 <= dVar186 * dVar207) {
                        dVar211 = ABS(dVar207);
                        if (ABS(dVar186) <= ABS(dVar207)) {
                          dVar211 = ABS(dVar186);
                        }
                        dVar211 = dVar211 + dVar211;
                      }
                      dVar200 = (dVar186 + dVar200) * 0.5;
                      dVar186 = ABS(dVar200);
                      if (dVar202 <= dVar186) {
                        dVar186 = dVar202;
                      }
                      dVar202 = ABS(dVar196);
                      if (dVar204 <= dVar202) {
                        dVar202 = dVar204;
                      }
                      dVar186 = ABS(dVar205 * 1.3333333333333333 +
                                    (dVar202 * (double)((ulong)dVar196 & 0x8000000000000000 |
                                                       0x3ff0000000000000) +
                                    dVar186 * (double)((ulong)dVar200 & 0x8000000000000000 |
                                                      0x3ff0000000000000)) * -0.16666666666666666);
                      if (dVar211 <= dVar186) {
                        dVar186 = dVar211;
                      }
                      dVar203 = dVar186 * (double)((ulong)dVar205 & 0x8000000000000000 |
                                                  0x3ff0000000000000) *
                                (-1.0 - pdVar38[lVar92 + lVar96 + (lVar122 - lVar151)] * dVar179) *
                                0.5 + dVar203;
                    }
LAB_002ebcb0:
                    iVar161 = iVar85 + -2;
                    dVar211 = pdVar54[lVar94 + lVar141 + (iVar161 - iVar17)];
                    if ((((dVar211 == 1.0) && (!NAN(dVar211))) && (dVar187 == 1.0)) &&
                       (!NAN(dVar187))) {
                      if ((pdVar54[lVar94 + lVar141 + ((iVar85 + -3) - iVar17)] == 1.0) &&
                         (!NAN(pdVar54[lVar94 + lVar141 + ((iVar85 + -3) - iVar17)]))) {
                        if ((pdVar54[lVar94 + lVar141 + ((iVar85 + 1) - iVar17)] == 1.0) &&
                           (!NAN(pdVar54[lVar94 + lVar141 + ((iVar85 + 1) - iVar17)]))) {
                          dVar211 = pdVar35[lVar118 + lVar91 + lVar95 + (lVar175 - lVar159)];
                          dVar186 = (pdVar35 + lVar118 + lVar91 + lVar95 + (lVar175 - lVar159))[1];
                          dVar204 = dVar211 - pdVar35[lVar118 + lVar91 + lVar95 + (iVar161 - iVar5)]
                          ;
                          dVar200 = pdVar35[lVar118 + lVar91 + lVar95 + (iVar161 - iVar5)] -
                                    pdVar35[lVar118 + lVar91 + lVar95 + ((iVar85 + -3) - iVar5)];
                          dVar187 = 0.0;
                          dVar202 = 0.0;
                          if (0.0 <= dVar204 * dVar200) {
                            dVar202 = ABS(dVar204);
                            if (ABS(dVar200) <= ABS(dVar204)) {
                              dVar202 = ABS(dVar200);
                            }
                            dVar202 = dVar202 + dVar202;
                          }
                          dVar207 = dVar186 - dVar211;
                          dVar186 = pdVar35[lVar118 + lVar91 + lVar95 + ((iVar85 + 1) - iVar5)] -
                                    dVar186;
                          dVar196 = (dVar207 + dVar186) * 0.5;
                          if (0.0 <= dVar186 * dVar207) {
                            dVar187 = ABS(dVar186);
                            if (ABS(dVar207) <= ABS(dVar186)) {
                              dVar187 = ABS(dVar207);
                            }
                            dVar187 = dVar187 + dVar187;
                          }
                          dVar205 = (dVar204 + dVar207) * 0.5;
                          dVar186 = 0.0;
                          if (0.0 <= dVar204 * dVar207) {
                            dVar186 = ABS(dVar207);
                            if (ABS(dVar204) <= ABS(dVar207)) {
                              dVar186 = ABS(dVar204);
                            }
                            dVar186 = dVar186 + dVar186;
                          }
                          dVar200 = (dVar204 + dVar200) * 0.5;
                          dVar204 = ABS(dVar200);
                          if (dVar202 <= dVar204) {
                            dVar204 = dVar202;
                          }
                          dVar202 = ABS(dVar196);
                          if (dVar187 <= dVar202) {
                            dVar202 = dVar187;
                          }
                          dVar187 = ABS(dVar205 * 1.3333333333333333 +
                                        (dVar202 * (double)((ulong)dVar196 & 0x8000000000000000 |
                                                           0x3ff0000000000000) +
                                        dVar204 * (double)((ulong)dVar200 & 0x8000000000000000 |
                                                          0x3ff0000000000000)) *
                                        -0.16666666666666666);
                          if (dVar186 <= dVar187) {
                            dVar187 = dVar186;
                          }
                          dVar211 = dVar187 * (double)((ulong)dVar205 & 0x8000000000000000 |
                                                      0x3ff0000000000000) *
                                    (1.0 - pdVar38[lVar92 + lVar96 + (lVar175 - lVar151)] * dVar179)
                                    * 0.5 + dVar211;
                          goto LAB_002ed6b8;
                        }
                      }
                    }
                    if (((dVar187 != 1.0) || (NAN(dVar187))) || ((dVar211 != 1.0 || (NAN(dVar211))))
                       ) {
                      lVar124 = lVar122 - lVar169;
                      local_878._0_4_ = 1;
                      goto LAB_002ec086;
                    }
                    dVar208 = (1.0 - pdVar38[lVar92 + lVar96 + (lVar175 - lVar151)] * dVar179) * 0.5
                    ;
                    dVar211 = pdVar35[lVar118 + lVar91 + lVar95 + (lVar175 - lVar159)];
                    dVar187 = (pdVar35 + lVar118 + lVar91 + lVar95 + (lVar175 - lVar159))[1];
                    dVar202 = dVar211 - pdVar35[lVar118 + lVar91 + lVar95 + (iVar161 - iVar5)];
                    dVar204 = dVar187 - dVar211;
                    dVar202 = dVar202 + dVar202;
                    dVar204 = dVar204 + dVar204;
                    dVar187 = (dVar187 - pdVar35[lVar118 + lVar91 + lVar95 + (iVar161 - iVar5)]) *
                              0.5;
                    dVar200 = ABS(dVar202);
                    uVar178 = -(ulong)(0.0 < dVar187);
                    dVar187 = ABS(dVar187);
                    dVar186 = ABS(dVar204);
                    if (dVar200 <= dVar187) {
                      dVar187 = dVar200;
                    }
                    if (dVar187 <= dVar186) {
                      dVar186 = dVar187;
                    }
                    uVar185 = -(ulong)(0.0 < dVar202 * dVar204) & (ulong)dVar186;
                    dVar187 = (double)(~uVar178 & (uVar185 ^ 0x8000000000000000) | uVar178 & uVar185
                                      );
                  }
                  dVar211 = dVar187 * dVar208 + dVar211;
                }
LAB_002ed6b8:
                pdVar45[lVar87 * lVar48 +
                        (lVar119 - iVar138) * lVar47 +
                        lVar107 * lVar46 + (long)(int)(~uVar12 + iVar85)] = dVar211;
                pdVar41[lVar87 * lVar44 +
                        (lVar119 - iVar11) * lVar43 + lVar108 * lVar42 + (lVar122 - iVar9)] =
                     dVar203;
                lVar122 = lVar122 + 1;
                local_730 = local_730 + 1;
                local_738 = local_738 + 1;
                local_728 = local_728 + 1;
                iVar162 = iVar162 + 1;
                iVar80 = iVar80 + 1;
                local_97c = local_97c + 1;
                iVar3 = iVar3 + 1;
                pdVar176 = pdVar176 + 1;
                lVar175 = lVar2;
              } while (iVar28 + 1 != (int)lVar122);
            }
          }
          local_7f0 = local_7f0 + lVar33;
          local_7e8 = local_7e8 + lVar33;
          local_7e0 = local_7e0 + lVar33;
          local_868 = local_868 + lVar34;
          lVar119 = lVar1;
        }
        lVar87 = lVar87 + 1;
        local_818 = local_818 + lVar37;
      } while( true );
    }
  }
  else {
    iVar7 = (xebox->bigend).vect[0];
  }
  A[0][0] = (Real)q->p;
  A[0][1] = (Real)q->jstride;
  A[0][2] = (Real)q->kstride;
  A[1][0] = (Real)q->nstride;
  A[1][1] = *(Real *)&q->begin;
  uVar191 = *(undefined8 *)&(q->begin).z;
  uVar69 = (q->end).y;
  A[2]._4_8_ = *(undefined8 *)&(q->end).z;
  A[1][2]._0_4_ = (undefined4)uVar191;
  A[1][2]._4_4_ = (undefined4)((ulong)uVar191 >> 0x20);
  A[2][2] = (Real)ccvel->p;
  A[3][0] = (Real)ccvel->jstride;
  A[3][1] = (Real)ccvel->kstride;
  A[3][2] = (Real)ccvel->nstride;
  A[4][0] = *(Real *)&ccvel->begin;
  uVar70 = (ccvel->end).x;
  uVar71 = (ccvel->end).y;
  A._116_8_ = *(undefined8 *)&(ccvel->end).z;
  A[4][1]._0_4_ = (undefined4)*(undefined8 *)&(ccvel->begin).z;
  A[6][1] = (Real)Imx->p;
  A[6][2] = (Real)Imx->jstride;
  A[7][0] = (Real)Imx->kstride;
  A[7][1] = (Real)Imx->nstride;
  A[7][2] = *(Real *)&Imx->begin;
  uVar191 = *(undefined8 *)&(Imx->begin).z;
  uVar72 = (Imx->end).y;
  A[8]._12_8_ = *(undefined8 *)&(Imx->end).z;
  A[8][0]._0_4_ = (undefined4)uVar191;
  A[8][0]._4_4_ = (undefined4)((ulong)uVar191 >> 0x20);
  A[9][0] = (Real)Ipx->p;
  A[9][1] = (Real)Ipx->jstride;
  A[9][2] = (Real)Ipx->kstride;
  A[10][0] = (Real)Ipx->nstride;
  A[10][1] = *(Real *)&Ipx->begin;
  uVar73 = (Ipx->end).x;
  uVar74 = (Ipx->end).y;
  A[0xb]._4_8_ = *(undefined8 *)&(Ipx->end).z;
  A[10][2]._0_4_ = (undefined4)*(undefined8 *)&(Ipx->begin).z;
  A[0xc][0] = (Real)pbc;
  A[0xc][1] = (Real)flag->p;
  A[0xc][2] = (Real)flag->jstride;
  A[0xd][0] = (Real)flag->kstride;
  A[0xd][1] = (Real)flag->nstride;
  A[0xd][2] = *(Real *)&flag->begin;
  uVar191 = *(undefined8 *)&(flag->begin).z;
  uVar75 = (flag->end).y;
  A[0xe]._12_8_ = *(undefined8 *)&(flag->end).z;
  A[0xe][0]._0_4_ = (undefined4)uVar191;
  A[0xe][0]._4_4_ = (undefined4)((ulong)uVar191 >> 0x20);
  A[0xf][0] = (Real)ccc->p;
  A[0xf][1] = (Real)ccc->jstride;
  A[0xf][2] = (Real)ccc->kstride;
  A[0x10][0] = (Real)ccc->nstride;
  A[0x10][1] = *(Real *)&ccc->begin;
  uVar191 = *(undefined8 *)&(ccc->begin).z;
  uVar76 = (ccc->end).y;
  A[0x11]._4_8_ = *(undefined8 *)&(ccc->end).z;
  A[0x10][2]._0_4_ = (undefined4)uVar191;
  A[0x10][2]._4_4_ = (undefined4)((ulong)uVar191 >> 0x20);
  A[0x11][2] = (Real)vfrac->p;
  A[0x12][0] = (Real)vfrac->jstride;
  A[0x12][1] = (Real)vfrac->kstride;
  A[0x12][2] = (Real)vfrac->nstride;
  A[0x13][0] = *(Real *)&vfrac->begin;
  uVar191 = *(undefined8 *)&(vfrac->begin).z;
  uVar77 = (vfrac->end).y;
  A._476_8_ = *(undefined8 *)&(vfrac->end).z;
  A[0x13][1]._0_4_ = (undefined4)uVar191;
  A[0x13][1]._4_4_ = (undefined4)((ulong)uVar191 >> 0x20);
  A[0x14][1] = (Real)fcx->p;
  A[0x14][2] = (Real)fcx->jstride;
  A[0x15][0] = (Real)fcx->kstride;
  A[0x15][1] = (Real)fcx->nstride;
  A[0x15][2] = *(Real *)&fcx->begin;
  uVar191 = *(undefined8 *)&(fcx->begin).z;
  uVar78 = (fcx->end).y;
  A[0x16]._12_8_ = *(undefined8 *)&(fcx->end).z;
  A[0x16][0]._0_4_ = (undefined4)uVar191;
  A[0x16][0]._4_4_ = (undefined4)((ulong)uVar191 >> 0x20);
  A[0x17][0] = (Real)fcy->p;
  A[0x17][1] = (Real)fcy->jstride;
  A[0x17][2] = (Real)fcy->kstride;
  A[0x18][0] = (Real)fcy->nstride;
  A[0x18][1] = *(Real *)&fcy->begin;
  uVar191 = *(undefined8 *)&(fcy->begin).z;
  uVar79 = (fcy->end).y;
  A[0x19]._4_8_ = *(undefined8 *)&(fcy->end).z;
  A[0x18][2]._0_4_ = (undefined4)uVar191;
  A[0x18][2]._4_4_ = (undefined4)((ulong)uVar191 >> 0x20);
  A[0x19][2] = (Real)fcz->p;
  A[0x1a][0] = (Real)fcz->jstride;
  A[0x1a][1] = (Real)fcz->kstride;
  A[0x1a][2] = (Real)fcz->nstride;
  iVar8 = (xebox->smallend).vect[0];
  iVar9 = (xebox->smallend).vect[1];
  iVar10 = (xebox->smallend).vect[2];
  iVar11 = (xebox->bigend).vect[1];
  iVar13 = (xebox->bigend).vect[2];
  A[2][0]._0_4_ = uVar69;
  A[4][1]._4_4_ = uVar70;
  A[4][2]._0_4_ = uVar71;
  A[5][1]._0_4_ = iVar168;
  A[5][1]._4_4_ = iVar174;
  A[5][2]._0_4_ = iVar5;
  A[5][2]._4_4_ = iVar158;
  A[6][0]._0_4_ = iVar4;
  A[6][0]._4_4_ = iVar6;
  A[8][1]._0_4_ = uVar72;
  A[10][2]._4_4_ = uVar73;
  A[0xb][0]._0_4_ = uVar74;
  A[0xb][2] = dVar179;
  A[0xe][1]._0_4_ = uVar75;
  A[0x11][0]._0_4_ = uVar76;
  A[0x13][2]._0_4_ = uVar77;
  A[0x16][1]._0_4_ = uVar78;
  A[0x19][0]._0_4_ = uVar79;
  for (iVar138 = 0; iVar168 = iVar10, iVar138 != 3; iVar138 = iVar138 + 1) {
    for (; iVar174 = iVar9, iVar168 <= iVar13; iVar168 = iVar168 + 1) {
      for (; iVar174 <= iVar11; iVar174 = iVar174 + 1) {
        iVar158 = iVar8;
        if (iVar8 <= iVar7) {
          do {
            PredictVelOnXFace::anon_class_680_18_15492e0f::operator()
                      ((anon_class_680_18_15492e0f *)A,iVar158,iVar174,iVar168,iVar138);
            iVar158 = iVar158 + 1;
          } while (iVar7 + 1 != iVar158);
        }
      }
    }
  }
  return;
}

Assistant:

void
EBPLM::PredictVelOnXFace (Box const& xebox,
                          Array4<Real> const& Imx, Array4<Real> const& Ipx,
                          Array4<Real const> const& q,
                          Array4<Real const> const& ccvel,
                          Array4<EBCellFlag const> const& flag,
                          Array4<Real const> const& vfrac,
                          AMREX_D_DECL(Array4<Real const> const& fcx,
                                       Array4<Real const> const& fcy,
                                       Array4<Real const> const& fcz),
                          Array4<Real const> const& ccc,
                          Geometry& geom,
                          Real dt,
                          Vector<BCRec> const& h_bcrec,
                          BCRec const* pbc)
{
    const Real dx = geom.CellSize(0);
    const Real dtdx = dt/dx;

    int ncomp = AMREX_SPACEDIM;

    const Box& domain_box = geom.Domain();
    const int domain_ilo = domain_box.smallEnd(0);
    const int domain_ihi = domain_box.bigEnd(0);
    const int domain_jlo = domain_box.smallEnd(1);
    const int domain_jhi = domain_box.bigEnd(1);

    // At an ext_dir boundary, the boundary value is on the face, not cell center.
    auto extdir_lohi_x = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::x));
    auto extdir_lohi_y = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::y));

    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;

#if (AMREX_SPACEDIM == 3)
    const int domain_klo = domain_box.smallEnd(2);
    const int domain_khi = domain_box.bigEnd(2);
    auto extdir_lohi_z = has_extdir_or_ho(h_bcrec.data(), AMREX_SPACEDIM, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;
#endif

    if ( (has_extdir_or_ho_lo_x && domain_ilo >= xebox.smallEnd(0)-1) ||
         (has_extdir_or_ho_hi_x && domain_ihi <= xebox.bigEnd(0)    ) ||
#if (AMREX_SPACEDIM == 3)
         (has_extdir_or_ho_lo_z && domain_klo >= xebox.smallEnd(2)-1) ||
         (has_extdir_or_ho_hi_z && domain_khi <= xebox.bigEnd(2)    ) ||
#endif
         (has_extdir_or_ho_lo_y && domain_jlo >= xebox.smallEnd(1)-1) ||
         (has_extdir_or_ho_hi_y && domain_jhi <= xebox.bigEnd(1)    ) )
    {
        amrex::ParallelFor(xebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                                  AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imx,Ipx,dtdx,pbc,flag,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apx(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(-1,0,0))
            {
                const auto& bc = pbc[n];
                bool extdir_or_ho_ilo = (bc.lo(0) == BCType::ext_dir) ||
                                        (bc.lo(0) == BCType::hoextrap);
                bool extdir_or_ho_ihi = (bc.hi(0) == BCType::ext_dir) ||
                                        (bc.hi(0) == BCType::hoextrap);
                bool extdir_or_ho_jlo = (bc.lo(1) == BCType::ext_dir) ||
                                        (bc.lo(1) == BCType::hoextrap);
                bool extdir_or_ho_jhi = (bc.hi(1) == BCType::ext_dir) ||
                                        (bc.hi(1) == BCType::hoextrap);
#if (AMREX_SPACEDIM == 3)
                bool extdir_or_ho_klo = (bc.lo(2) == BCType::ext_dir) ||
                                        (bc.lo(2) == BCType::hoextrap);
                bool extdir_or_ho_khi = (bc.hi(2) == BCType::ext_dir) ||
                                        (bc.hi(2) == BCType::hoextrap);
#endif

                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. &&
                                           vfrac(i+1,j,k) == 1. && vfrac(i+2,j,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i  ,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,0) * dtdx) *
                        amrex_calc_xslope_extdir(i,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i-1,j,k) == 1. && vfrac(i+1,j,k) == 1.) {

                    int order = 2;
                    qpls = q(i  ,j,k,n) + 0.5 * (-1.0 - ccvel(i,j,k,0) * dtdx) *
                        amrex_calc_xslope_extdir(i,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

                // We need to use LS slopes
                } else {

                    Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                    Real zf = fcx(i,j,k,1);
#endif
                    AMREX_D_TERM(Real delta_x = -0.5 - ccc(i,j,k,0);,
                                 Real delta_y =  yf  - ccc(i,j,k,1);,
                                 Real delta_z =  zf  - ccc(i,j,k,2););

                    Real qcc_max = amrex::max(q(i,j,k,n), q(i-1,j,k,n));
                    Real qcc_min = amrex::min(q(i,j,k,n), q(i-1,j,k,n));

                    // This will be used in the EB slope routine only if the slope can be computed without LS
                    int max_order = 2;

                    const auto& slopes_eb_hi = amrex_lim_slopes_extdir_eb(i,j,k,n,q,ccc,vfrac,
                                               AMREX_D_DECL(fcx,fcy,fcz), flag,
                                               AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                               AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                               AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                               AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                               max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdx * ccvel(i,j,k,0) * slopes_eb_hi[0];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i-1,j,k) with all values at cell centers
                if (vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. && vfrac(i-3,j,k) == 1. &&
                                             vfrac(i  ,j,k) == 1. && vfrac(i+1,j,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i-1,j,k,n) + 0.5 * ( 1.0 - ccvel(i-1,j,k,0) * dtdx) *
                        amrex_calc_xslope_extdir(i-1,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. && vfrac(i  ,j,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i-1,j,k,n) + 0.5 * ( 1.0 - ccvel(i-1,j,k,0) * dtdx) *
                        amrex_calc_xslope_extdir(i-1,j,k,n,order,q,extdir_or_ho_ilo,extdir_or_ho_ihi,domain_ilo,domain_ihi);

                // We need to use LS slopes
                } else {

                    Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                    Real zf = fcx(i,j,k,1);
#endif
                    AMREX_D_TERM(Real delta_x = 0.5 - ccc(i-1,j,k,0);,
                                 Real delta_y = yf  - ccc(i-1,j,k,1);,
                                 Real delta_z = zf  - ccc(i-1,j,k,2););

                    Real qcc_max = amrex::max(q(i,j,k,n), q(i-1,j,k,n));
                    Real qcc_min = amrex::min(q(i,j,k,n), q(i-1,j,k,n));

                    // This will be used in the EB slope routine only if the slope can be computed without LS
                    int max_order = 2;

                    const auto& slopes_eb_lo = amrex_lim_slopes_extdir_eb(i-1,j,k,n,q,ccc,vfrac,
                                               AMREX_D_DECL(fcx,fcy,fcz), flag,
                                               AMREX_D_DECL(extdir_or_ho_ilo, extdir_or_ho_jlo, extdir_or_ho_klo),
                                               AMREX_D_DECL(extdir_or_ho_ihi, extdir_or_ho_jhi, extdir_or_ho_khi),
                                               AMREX_D_DECL(domain_ilo, domain_jlo, domain_klo),
                                               AMREX_D_DECL(domain_ihi, domain_jhi, domain_khi),
                                               max_order);


#if (AMREX_SPACEDIM == 3)
                   qmns = q(i-1,j,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i-1,j,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdx * ccvel(i-1,j,k,0) * slopes_eb_lo[0];

                }  // end of making qmns
            }

            Ipx(i-1,j,k,n) = qmns;
            Imx(i  ,j,k,n) = qpls;
        });
    }
    else // The cases below are not near any domain boundary
    {
        amrex::ParallelFor(xebox, ncomp, [q,ccvel,AMREX_D_DECL(domain_ilo,domain_jlo,domain_klo),
                                          AMREX_D_DECL(domain_ihi,domain_jhi,domain_khi),
                                          Imx,Ipx,dtdx,pbc,flag,ccc,vfrac,AMREX_D_DECL(fcx,fcy,fcz)]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            Real qpls(0.);
            Real qmns(0.);

            // This means apx(i,j,k) > 0 and we have un-covered cells on both sides
            if (flag(i,j,k).isConnected(-1,0,0))
            {
                // *************************************************
                // Making qpls
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i,j,k) with all values at cell centers
                if (vfrac(i,j,k) == 1. && vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. &&
                                           vfrac(i+1,j,k) == 1. && vfrac(i+2,j,k) == 1.)
                {
                    int order = 4;
                    qpls = q(i  ,j,k,n) + 0.5 * (-1.0 - ccvel(i  ,j,k,0) * dtdx) *
                        amrex_calc_xslope(i,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i,j,k) == 1. && vfrac(i-1,j,k) == 1. && vfrac(i+1,j,k) == 1.) {

                    int order = 2;
                    qpls = q(i  ,j,k,n) + 0.5 * (-1.0 - ccvel(i  ,j,k,0) * dtdx) *
                        amrex_calc_xslope(i,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcx(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_x = -0.5 - ccc(i,j,k,0);,
                                Real delta_y =  yf  - ccc(i,j,k,1);,
                                Real delta_z =  zf  - ccc(i,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i-1,j,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i-1,j,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_hi = amrex_lim_slopes_eb(i,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1]
                                     + delta_z * slopes_eb_hi[2];
#else
                   qpls = q(i,j,k,n) + delta_x * slopes_eb_hi[0]
                                     + delta_y * slopes_eb_hi[1];
#endif
                   qpls = amrex::max(amrex::min(qpls, qcc_max), qcc_min);

                   qpls -= 0.5 * dtdx * ccvel(i,j,k,0) * slopes_eb_hi[0];

                }  // end of making qpls

                // *************************************************
                // Making qmns
                // *************************************************

                // We have enough cells to do 4th order slopes centered on (i-1,j,k) with all values at cell centers
                if (vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. && vfrac(i-3,j,k) == 1. &&
                                             vfrac(i  ,j,k) == 1. && vfrac(i+1,j,k) == 1.)
                {
                    int order = 4;
                    qmns = q(i-1,j,k,n) + 0.5 * ( 1.0 - ccvel(i-1,j,k,0) * dtdx) *
                        amrex_calc_xslope(i-1,j,k,n,order,q);

                // We have enough cells to do 2nd order slopes with all values at cell centers
                } else if (vfrac(i-1,j,k) == 1. && vfrac(i-2,j,k) == 1. && vfrac(i  ,j,k) == 1.)
                {
                    int order = 2;
                    qmns = q(i-1,j,k,n) + 0.5 * ( 1.0 - ccvel(i-1,j,k,0) * dtdx) *
                        amrex_calc_xslope(i-1,j,k,n,order,q);

                // We need to use LS slopes
                } else {

                   Real yf = fcx(i,j,k,0); // local (y,z) of centroid of x-face we are extrapolating to
#if (AMREX_SPACEDIM == 3)
                   Real zf = fcx(i,j,k,1);
#endif
                   AMREX_D_TERM(Real delta_x = 0.5 - ccc(i-1,j,k,0);,
                                Real delta_y = yf  - ccc(i-1,j,k,1);,
                                Real delta_z = zf  - ccc(i-1,j,k,2););

                   Real qcc_max = amrex::max(q(i,j,k,n), q(i-1,j,k,n));
                   Real qcc_min = amrex::min(q(i,j,k,n), q(i-1,j,k,n));

                   // This will be used in the EB slope routine only if the slope can be computed without LS
                   int max_order = 2;

                   const auto& slopes_eb_lo = amrex_lim_slopes_eb(i-1,j,k,n,q,ccc,vfrac,
                                                                  AMREX_D_DECL(fcx,fcy,fcz),flag,max_order);

#if (AMREX_SPACEDIM == 3)
                   qmns = q(i-1,j,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1]
                                       + delta_z * slopes_eb_lo[2];
#else
                   qmns = q(i-1,j,k,n) + delta_x * slopes_eb_lo[0]
                                       + delta_y * slopes_eb_lo[1];
#endif
                   qmns = amrex::max(amrex::min(qmns, qcc_max), qcc_min);

                   qmns -= 0.5 * dtdx * ccvel(i-1,j,k,0) * slopes_eb_lo[0];

                }  // end of making qmns
            }

            Ipx(i-1,j,k,n) = qmns;
            Imx(i  ,j,k,n) = qpls;
        });
    }
}